

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_1,_true,_embree::avx512::SubGridIntersectorKPluecker<8,_8,_true>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ushort uVar7;
  ushort uVar8;
  uint uVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  RTCRayQueryContext *pRVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined1 auVar25 [32];
  undefined8 uVar26;
  undefined8 uVar27;
  ulong uVar28;
  undefined8 uVar29;
  size_t k;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  byte bVar56;
  byte bVar57;
  int iVar58;
  ulong uVar59;
  long lVar60;
  byte bVar61;
  long lVar62;
  uint *puVar63;
  byte bVar64;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  ulong uVar65;
  long lVar66;
  Geometry *pGVar67;
  long lVar68;
  undefined1 (*pauVar69) [32];
  ulong *puVar70;
  byte bVar71;
  undefined4 uVar72;
  NodeRef root;
  ulong uVar73;
  bool bVar74;
  ulong uVar75;
  float fVar76;
  float fVar109;
  float fVar110;
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  float fVar111;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  float fVar115;
  float fVar120;
  float fVar121;
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [64];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [64];
  undefined1 auVar135 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar136 [16];
  undefined1 auVar142 [32];
  undefined1 auVar137 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar149 [16];
  float fVar148;
  undefined1 auVar150 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar155 [64];
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar160 [16];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  Precalculations pre;
  vfloat<8> lower_y;
  vfloat<8> upper_y;
  vfloat<8> upper_z;
  vfloat<8> lower_z;
  TravRayK<8,_true> tray;
  vfloat<8> lower_x;
  vfloat<8> upper_x;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  byte local_5ec8;
  Precalculations local_5ea9;
  RayK<8> *local_5ea8;
  long local_5ea0;
  uint local_5e98;
  uint local_5e94;
  RayK<8> *local_5e90;
  undefined4 local_5e84;
  RTCFilterFunctionNArguments local_5e80;
  undefined1 local_5e40 [32];
  undefined1 (*local_5e18) [32];
  ulong local_5e10;
  long local_5e08;
  undefined1 local_5e00 [32];
  BVH *local_5dd8;
  Intersectors *local_5dd0;
  Geometry *local_5dc8;
  long local_5dc0;
  long local_5db8;
  long local_5db0;
  ulong local_5da8;
  undefined1 local_5da0 [32];
  undefined1 local_5d80 [32];
  undefined1 local_5d60 [32];
  undefined1 local_5d40 [16];
  undefined1 local_5d30 [16];
  undefined1 local_5d20 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5d00;
  undefined1 local_5ca0 [32];
  undefined1 local_5c80 [32];
  undefined1 local_5c60 [32];
  undefined1 local_5c40 [8];
  float fStack_5c38;
  float fStack_5c34;
  float fStack_5c30;
  float fStack_5c2c;
  float fStack_5c28;
  undefined1 local_5c20 [8];
  float fStack_5c18;
  float fStack_5c14;
  float fStack_5c10;
  float fStack_5c0c;
  float fStack_5c08;
  undefined1 local_5c00 [32];
  int local_5be0;
  int iStack_5bdc;
  int iStack_5bd8;
  int iStack_5bd4;
  int iStack_5bd0;
  int iStack_5bcc;
  int iStack_5bc8;
  int iStack_5bc4;
  uint local_5bc0;
  uint uStack_5bbc;
  uint uStack_5bb8;
  uint uStack_5bb4;
  uint uStack_5bb0;
  uint uStack_5bac;
  uint uStack_5ba8;
  uint uStack_5ba4;
  uint local_5ba0;
  uint uStack_5b9c;
  uint uStack_5b98;
  uint uStack_5b94;
  uint uStack_5b90;
  uint uStack_5b8c;
  uint uStack_5b88;
  uint uStack_5b84;
  undefined1 local_5b80 [32];
  uint local_5b60;
  uint uStack_5b5c;
  uint uStack_5b58;
  uint uStack_5b54;
  uint uStack_5b50;
  uint uStack_5b4c;
  uint uStack_5b48;
  uint uStack_5b44;
  RTCHitN local_5b40 [32];
  undefined1 local_5b20 [32];
  undefined1 local_5b00 [8];
  float fStack_5af8;
  float fStack_5af4;
  float fStack_5af0;
  float fStack_5aec;
  float fStack_5ae8;
  uint uStack_5ae4;
  undefined1 local_5ae0 [32];
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [32];
  undefined1 local_5a80 [32];
  uint local_5a60;
  uint uStack_5a5c;
  uint uStack_5a58;
  uint uStack_5a54;
  uint uStack_5a50;
  uint uStack_5a4c;
  uint uStack_5a48;
  uint uStack_5a44;
  uint local_5a40;
  uint uStack_5a3c;
  uint uStack_5a38;
  uint uStack_5a34;
  uint uStack_5a30;
  uint uStack_5a2c;
  uint uStack_5a28;
  uint uStack_5a24;
  undefined1 local_5a20 [32];
  undefined8 local_5a00;
  undefined8 uStack_59f8;
  undefined8 local_59f0;
  undefined8 uStack_59e8;
  undefined8 local_59e0;
  undefined8 uStack_59d8;
  undefined8 local_59d0;
  undefined8 uStack_59c8;
  undefined8 local_59c0;
  undefined8 uStack_59b8;
  undefined8 local_59b0;
  undefined8 uStack_59a8;
  undefined8 local_59a0;
  undefined8 uStack_5998;
  undefined8 local_5990;
  undefined8 uStack_5988;
  undefined8 local_5980;
  undefined8 uStack_5978;
  undefined8 local_5970;
  undefined8 uStack_5968;
  undefined8 local_5960;
  undefined8 uStack_5958;
  undefined8 local_5950;
  undefined8 uStack_5948;
  undefined8 local_5940;
  undefined8 uStack_5938;
  undefined8 local_5930;
  undefined8 uStack_5928;
  undefined1 local_5920 [32];
  undefined1 local_5900 [32];
  undefined1 local_58e0 [32];
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar141 [32];
  undefined1 auVar143 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  
  local_5808 = (((BVH *)This->ptr)->root).ptr;
  if (local_5808 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar79 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar116 = ZEXT816(0) << 0x40;
      uVar75 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar116),5);
      uVar73 = vpcmpeqd_avx512vl(auVar79,(undefined1  [32])valid_i->field_0);
      uVar75 = uVar75 & uVar73;
      local_5ec8 = (byte)uVar75;
      if (local_5ec8 != 0) {
        local_5d00._0_8_ = *(undefined8 *)ray;
        local_5d00._8_8_ = *(undefined8 *)(ray + 8);
        local_5d00._16_8_ = *(undefined8 *)(ray + 0x10);
        local_5d00._24_8_ = *(undefined8 *)(ray + 0x18);
        local_5d00._32_8_ = *(undefined8 *)(ray + 0x20);
        local_5d00._40_8_ = *(undefined8 *)(ray + 0x28);
        local_5d00._48_8_ = *(undefined8 *)(ray + 0x30);
        local_5d00._56_8_ = *(undefined8 *)(ray + 0x38);
        local_5d00._64_8_ = *(undefined8 *)(ray + 0x40);
        local_5d00._72_8_ = *(undefined8 *)(ray + 0x48);
        local_5d00._80_8_ = *(undefined8 *)(ray + 0x50);
        local_5d00._88_8_ = *(undefined8 *)(ray + 0x58);
        local_5ca0 = *(undefined1 (*) [32])(ray + 0x80);
        local_5c80 = *(undefined1 (*) [32])(ray + 0xa0);
        local_5c60 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar162 = ZEXT3264(auVar79);
        vandps_avx512vl(local_5ca0,auVar79);
        auVar83._8_4_ = 0x219392ef;
        auVar83._0_8_ = 0x219392ef219392ef;
        auVar83._12_4_ = 0x219392ef;
        auVar83._16_4_ = 0x219392ef;
        auVar83._20_4_ = 0x219392ef;
        auVar83._24_4_ = 0x219392ef;
        auVar83._28_4_ = 0x219392ef;
        auVar134 = ZEXT3264(auVar83);
        uVar73 = vcmpps_avx512vl(auVar79,auVar83,1);
        auVar80 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar163 = ZEXT3264(auVar80);
        auVar81 = vdivps_avx512vl(auVar80,local_5ca0);
        vandps_avx512vl(local_5c80,auVar79);
        uVar65 = vcmpps_avx512vl(auVar81,auVar83,1);
        auVar82 = vdivps_avx512vl(auVar80,local_5c80);
        vandps_avx512vl(local_5c60,auVar79);
        uVar59 = vcmpps_avx512vl(auVar82,auVar83,1);
        auVar79 = vdivps_avx512vl(auVar80,local_5c60);
        bVar74 = (bool)((byte)uVar73 & 1);
        local_5c40._0_4_ = (uint)bVar74 * 0x5d5e0b6b | (uint)!bVar74 * auVar81._0_4_;
        bVar74 = (bool)((byte)(uVar73 >> 1) & 1);
        local_5c40._4_4_ = (uint)bVar74 * 0x5d5e0b6b | (uint)!bVar74 * auVar81._4_4_;
        bVar74 = (bool)((byte)(uVar73 >> 2) & 1);
        fStack_5c38 = (float)((uint)bVar74 * 0x5d5e0b6b | (uint)!bVar74 * auVar81._8_4_);
        bVar74 = (bool)((byte)(uVar73 >> 3) & 1);
        fStack_5c34 = (float)((uint)bVar74 * 0x5d5e0b6b | (uint)!bVar74 * auVar81._12_4_);
        bVar74 = (bool)((byte)(uVar73 >> 4) & 1);
        fStack_5c30 = (float)((uint)bVar74 * 0x5d5e0b6b | (uint)!bVar74 * auVar81._16_4_);
        bVar74 = (bool)((byte)(uVar73 >> 5) & 1);
        fStack_5c2c = (float)((uint)bVar74 * 0x5d5e0b6b | (uint)!bVar74 * auVar81._20_4_);
        bVar74 = (bool)((byte)(uVar73 >> 6) & 1);
        fStack_5c28 = (float)((uint)bVar74 * 0x5d5e0b6b | (uint)!bVar74 * auVar81._24_4_);
        bVar74 = SUB81(uVar73 >> 7,0);
        register0x00000918 = (uint)bVar74 * 0x5d5e0b6b | (uint)!bVar74 * auVar81._28_4_;
        bVar74 = (bool)((byte)uVar65 & 1);
        local_5c20._0_4_ = (uint)bVar74 * 0x5d5e0b6b | (uint)!bVar74 * auVar82._0_4_;
        bVar74 = (bool)((byte)(uVar65 >> 1) & 1);
        local_5c20._4_4_ = (uint)bVar74 * 0x5d5e0b6b | (uint)!bVar74 * auVar82._4_4_;
        bVar74 = (bool)((byte)(uVar65 >> 2) & 1);
        fStack_5c18 = (float)((uint)bVar74 * 0x5d5e0b6b | (uint)!bVar74 * auVar82._8_4_);
        bVar74 = (bool)((byte)(uVar65 >> 3) & 1);
        fStack_5c14 = (float)((uint)bVar74 * 0x5d5e0b6b | (uint)!bVar74 * auVar82._12_4_);
        bVar74 = (bool)((byte)(uVar65 >> 4) & 1);
        fStack_5c10 = (float)((uint)bVar74 * 0x5d5e0b6b | (uint)!bVar74 * auVar82._16_4_);
        bVar74 = (bool)((byte)(uVar65 >> 5) & 1);
        fStack_5c0c = (float)((uint)bVar74 * 0x5d5e0b6b | (uint)!bVar74 * auVar82._20_4_);
        bVar74 = (bool)((byte)(uVar65 >> 6) & 1);
        fStack_5c08 = (float)((uint)bVar74 * 0x5d5e0b6b | (uint)!bVar74 * auVar82._24_4_);
        bVar74 = SUB81(uVar65 >> 7,0);
        register0x00000918 = (uint)bVar74 * 0x5d5e0b6b | (uint)!bVar74 * auVar82._28_4_;
        bVar74 = (bool)((byte)uVar59 & 1);
        local_5c00._0_4_ = (uint)bVar74 * 0x5d5e0b6b | (uint)!bVar74 * auVar79._0_4_;
        bVar74 = (bool)((byte)(uVar59 >> 1) & 1);
        local_5c00._4_4_ = (uint)bVar74 * 0x5d5e0b6b | (uint)!bVar74 * auVar79._4_4_;
        bVar74 = (bool)((byte)(uVar59 >> 2) & 1);
        local_5c00._8_4_ = (uint)bVar74 * 0x5d5e0b6b | (uint)!bVar74 * auVar79._8_4_;
        bVar74 = (bool)((byte)(uVar59 >> 3) & 1);
        local_5c00._12_4_ = (uint)bVar74 * 0x5d5e0b6b | (uint)!bVar74 * auVar79._12_4_;
        bVar74 = (bool)((byte)(uVar59 >> 4) & 1);
        local_5c00._16_4_ = (uint)bVar74 * 0x5d5e0b6b | (uint)!bVar74 * auVar79._16_4_;
        bVar74 = (bool)((byte)(uVar59 >> 5) & 1);
        local_5c00._20_4_ = (uint)bVar74 * 0x5d5e0b6b | (uint)!bVar74 * auVar79._20_4_;
        bVar74 = (bool)((byte)(uVar59 >> 6) & 1);
        local_5c00._24_4_ = (uint)bVar74 * 0x5d5e0b6b | (uint)!bVar74 * auVar79._24_4_;
        bVar74 = SUB81(uVar59 >> 7,0);
        local_5c00._28_4_ = (uint)bVar74 * 0x5d5e0b6b | (uint)!bVar74 * auVar79._28_4_;
        uVar73 = vcmpps_avx512vl(_local_5c40,ZEXT1632(auVar116),1);
        auVar79 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        local_5be0 = (uint)((byte)uVar73 & 1) * auVar79._0_4_;
        iStack_5bdc = (uint)((byte)(uVar73 >> 1) & 1) * auVar79._4_4_;
        iStack_5bd8 = (uint)((byte)(uVar73 >> 2) & 1) * auVar79._8_4_;
        iStack_5bd4 = (uint)((byte)(uVar73 >> 3) & 1) * auVar79._12_4_;
        iStack_5bd0 = (uint)((byte)(uVar73 >> 4) & 1) * auVar79._16_4_;
        iStack_5bcc = (uint)((byte)(uVar73 >> 5) & 1) * auVar79._20_4_;
        iStack_5bc8 = (uint)((byte)(uVar73 >> 6) & 1) * auVar79._24_4_;
        iStack_5bc4 = (uint)(byte)(uVar73 >> 7) * auVar79._28_4_;
        auVar80 = ZEXT1632(auVar116);
        uVar73 = vcmpps_avx512vl(_local_5c20,auVar80,5);
        auVar79 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar74 = (bool)((byte)uVar73 & 1);
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar73 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar73 >> 3) & 1);
        bVar16 = (bool)((byte)(uVar73 >> 4) & 1);
        bVar18 = (bool)((byte)(uVar73 >> 5) & 1);
        bVar21 = (bool)((byte)(uVar73 >> 6) & 1);
        bVar24 = SUB81(uVar73 >> 7,0);
        local_5bc0 = (uint)bVar74 * auVar79._0_4_ | (uint)!bVar74 * 0x60;
        uStack_5bbc = (uint)bVar13 * auVar79._4_4_ | (uint)!bVar13 * 0x60;
        uStack_5bb8 = (uint)bVar14 * auVar79._8_4_ | (uint)!bVar14 * 0x60;
        uStack_5bb4 = (uint)bVar15 * auVar79._12_4_ | (uint)!bVar15 * 0x60;
        uStack_5bb0 = (uint)bVar16 * auVar79._16_4_ | (uint)!bVar16 * 0x60;
        uStack_5bac = (uint)bVar18 * auVar79._20_4_ | (uint)!bVar18 * 0x60;
        uStack_5ba8 = (uint)bVar21 * auVar79._24_4_ | (uint)!bVar21 * 0x60;
        uStack_5ba4 = (uint)bVar24 * auVar79._28_4_ | (uint)!bVar24 * 0x60;
        uVar73 = vcmpps_avx512vl(local_5c00,auVar80,5);
        auVar79 = vpbroadcastd_avx512vl(ZEXT416(0x80));
        bVar74 = (bool)((byte)uVar73 & 1);
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar73 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar73 >> 3) & 1);
        bVar16 = (bool)((byte)(uVar73 >> 4) & 1);
        bVar18 = (bool)((byte)(uVar73 >> 5) & 1);
        bVar21 = (bool)((byte)(uVar73 >> 6) & 1);
        bVar24 = SUB81(uVar73 >> 7,0);
        local_5ba0 = (uint)bVar74 * auVar79._0_4_ | (uint)!bVar74 * 0xa0;
        uStack_5b9c = (uint)bVar13 * auVar79._4_4_ | (uint)!bVar13 * 0xa0;
        uStack_5b98 = (uint)bVar14 * auVar79._8_4_ | (uint)!bVar14 * 0xa0;
        uStack_5b94 = (uint)bVar15 * auVar79._12_4_ | (uint)!bVar15 * 0xa0;
        uStack_5b90 = (uint)bVar16 * auVar79._16_4_ | (uint)!bVar16 * 0xa0;
        uStack_5b8c = (uint)bVar18 * auVar79._20_4_ | (uint)!bVar18 * 0xa0;
        uStack_5b88 = (uint)bVar21 * auVar79._24_4_ | (uint)!bVar21 * 0xa0;
        uStack_5b84 = (uint)bVar24 * auVar79._28_4_ | (uint)!bVar24 * 0xa0;
        local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar164 = ZEXT3264(local_4680);
        auVar79 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar80);
        local_5b80._0_4_ =
             (uint)(local_5ec8 & 1) * auVar79._0_4_ |
             (uint)!(bool)(local_5ec8 & 1) * local_4680._0_4_;
        bVar74 = (bool)((byte)(uVar75 >> 1) & 1);
        local_5b80._4_4_ = (uint)bVar74 * auVar79._4_4_ | (uint)!bVar74 * local_4680._4_4_;
        bVar74 = (bool)((byte)(uVar75 >> 2) & 1);
        local_5b80._8_4_ = (uint)bVar74 * auVar79._8_4_ | (uint)!bVar74 * local_4680._8_4_;
        bVar74 = (bool)((byte)(uVar75 >> 3) & 1);
        local_5b80._12_4_ = (uint)bVar74 * auVar79._12_4_ | (uint)!bVar74 * local_4680._12_4_;
        bVar74 = (bool)((byte)(uVar75 >> 4) & 1);
        local_5b80._16_4_ = (uint)bVar74 * auVar79._16_4_ | (uint)!bVar74 * local_4680._16_4_;
        bVar74 = (bool)((byte)(uVar75 >> 5) & 1);
        local_5b80._20_4_ = (uint)bVar74 * auVar79._20_4_ | (uint)!bVar74 * local_4680._20_4_;
        bVar74 = (bool)((byte)(uVar75 >> 6) & 1);
        local_5b80._24_4_ = (uint)bVar74 * auVar79._24_4_ | (uint)!bVar74 * local_4680._24_4_;
        bVar74 = SUB81(uVar75 >> 7,0);
        local_5b80._28_4_ = (uint)bVar74 * auVar79._28_4_ | (uint)!bVar74 * local_4680._28_4_;
        local_5e84 = (undefined4)uVar75;
        auVar79 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar80);
        bVar74 = (bool)((byte)(uVar75 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar75 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar75 >> 3) & 1);
        bVar15 = (bool)((byte)(uVar75 >> 4) & 1);
        bVar16 = (bool)((byte)(uVar75 >> 5) & 1);
        bVar18 = (bool)((byte)(uVar75 >> 6) & 1);
        bVar21 = SUB81(uVar75 >> 7,0);
        local_5b60 = (uint)(local_5ec8 & 1) * auVar79._0_4_ |
                     (uint)!(bool)(local_5ec8 & 1) * -0x800000;
        uStack_5b5c = (uint)bVar74 * auVar79._4_4_ | (uint)!bVar74 * -0x800000;
        uStack_5b58 = (uint)bVar13 * auVar79._8_4_ | (uint)!bVar13 * -0x800000;
        uStack_5b54 = (uint)bVar14 * auVar79._12_4_ | (uint)!bVar14 * -0x800000;
        uStack_5b50 = (uint)bVar15 * auVar79._16_4_ | (uint)!bVar15 * -0x800000;
        uStack_5b4c = (uint)bVar16 * auVar79._20_4_ | (uint)!bVar16 * -0x800000;
        uStack_5b48 = (uint)bVar18 * auVar79._24_4_ | (uint)!bVar18 * -0x800000;
        uStack_5b44 = (uint)bVar21 * auVar79._28_4_ | (uint)!bVar21 * -0x800000;
        local_5ec8 = ~local_5ec8;
        local_5dd0 = This;
        local_5dd8 = (BVH *)This->ptr;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar75 = 7;
        }
        else {
          uVar75 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5e90 = ray + 0x100;
        puVar70 = local_5800;
        pauVar69 = (undefined1 (*) [32])local_4640;
        local_5810 = 0xfffffffffffffff8;
        local_4660 = local_5b80;
        local_5e18 = (undefined1 (*) [32])&local_5a60;
        auVar79 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
        auVar165 = ZEXT3264(auVar79);
        auVar79 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
        auVar166 = ZEXT3264(auVar79);
        auVar79 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
        auVar167 = ZEXT3264(auVar79);
        auVar79 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar161 = ZEXT3264(auVar79);
        local_5e10 = uVar75;
        local_5ea8 = ray;
LAB_007d2983:
        do {
          auVar79._4_4_ = uStack_5b5c;
          auVar79._0_4_ = local_5b60;
          auVar79._8_4_ = uStack_5b58;
          auVar79._12_4_ = uStack_5b54;
          auVar79._16_4_ = uStack_5b50;
          auVar79._20_4_ = uStack_5b4c;
          auVar79._24_4_ = uStack_5b48;
          auVar79._28_4_ = uStack_5b44;
          do {
            root.ptr = puVar70[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_007d3fac;
            puVar70 = puVar70 + -1;
            auVar80 = pauVar69[-1];
            auVar125 = ZEXT3264(auVar80);
            pauVar69 = pauVar69 + -1;
            uVar73 = vcmpps_avx512vl(auVar80,auVar79,1);
          } while ((char)uVar73 == '\0');
          uVar72 = (undefined4)uVar73;
          if (uVar75 < (uint)POPCOUNT(uVar72)) {
LAB_007d29cc:
            do {
              uVar73 = 8;
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_007d3fac;
                auVar90._4_4_ = uStack_5b5c;
                auVar90._0_4_ = local_5b60;
                auVar90._8_4_ = uStack_5b58;
                auVar90._12_4_ = uStack_5b54;
                auVar90._16_4_ = uStack_5b50;
                auVar90._20_4_ = uStack_5b4c;
                auVar90._24_4_ = uStack_5b48;
                auVar90._28_4_ = uStack_5b44;
                uVar26 = vcmpps_avx512vl(auVar125._0_32_,auVar90,9);
                if ((char)uVar26 != '\0') {
                  local_5dc0 = (ulong)((uint)root.ptr & 0xf) - 8;
                  bVar61 = local_5ec8;
                  if (local_5dc0 != 0) {
                    uVar73 = root.ptr & 0xfffffffffffffff0;
                    bVar61 = ~local_5ec8;
                    lVar60 = 0;
                    do {
                      local_5db8 = lVar60;
                      lVar60 = lVar60 * 0x90;
                      auVar116._8_8_ = 0;
                      auVar116._0_8_ = *(ulong *)(uVar73 + 0x40 + lVar60);
                      auVar122._8_8_ = 0;
                      auVar122._0_8_ = *(ulong *)(uVar73 + 0x48 + lVar60);
                      uVar65 = vpcmpub_avx512vl(auVar116,auVar122,2);
                      if ((char)uVar65 != '\0') {
                        lVar60 = lVar60 + uVar73;
                        uVar65 = uVar65 & 0xff;
                        local_5db0 = lVar60;
                        do {
                          auVar78._8_8_ = 0;
                          auVar78._0_8_ = *(ulong *)(lVar60 + 0x40);
                          auVar79 = vpmovzxbd_avx2(auVar78);
                          auVar79 = vcvtdq2ps_avx(auVar79);
                          uVar72 = *(undefined4 *)(lVar60 + 0x7c);
                          auVar91._4_4_ = uVar72;
                          auVar91._0_4_ = uVar72;
                          auVar91._8_4_ = uVar72;
                          auVar91._12_4_ = uVar72;
                          auVar91._16_4_ = uVar72;
                          auVar91._20_4_ = uVar72;
                          auVar91._24_4_ = uVar72;
                          auVar91._28_4_ = uVar72;
                          uVar72 = *(undefined4 *)(lVar60 + 0x70);
                          auVar94._4_4_ = uVar72;
                          auVar94._0_4_ = uVar72;
                          auVar94._8_4_ = uVar72;
                          auVar94._12_4_ = uVar72;
                          auVar94._16_4_ = uVar72;
                          auVar94._20_4_ = uVar72;
                          auVar94._24_4_ = uVar72;
                          auVar94._28_4_ = uVar72;
                          auVar116 = vfmadd213ps_fma(auVar79,auVar91,auVar94);
                          auVar79 = ZEXT1632(auVar116);
                          local_5b40[0] = (RTCHitN)auVar79[0];
                          local_5b40[1] = (RTCHitN)auVar79[1];
                          local_5b40[2] = (RTCHitN)auVar79[2];
                          local_5b40[3] = (RTCHitN)auVar79[3];
                          local_5b40[4] = (RTCHitN)auVar79[4];
                          local_5b40[5] = (RTCHitN)auVar79[5];
                          local_5b40[6] = (RTCHitN)auVar79[6];
                          local_5b40[7] = (RTCHitN)auVar79[7];
                          local_5b40[8] = (RTCHitN)auVar79[8];
                          local_5b40[9] = (RTCHitN)auVar79[9];
                          local_5b40[10] = (RTCHitN)auVar79[10];
                          local_5b40[0xb] = (RTCHitN)auVar79[0xb];
                          local_5b40[0xc] = (RTCHitN)auVar79[0xc];
                          local_5b40[0xd] = (RTCHitN)auVar79[0xd];
                          local_5b40[0xe] = (RTCHitN)auVar79[0xe];
                          local_5b40[0xf] = (RTCHitN)auVar79[0xf];
                          local_5b40[0x10] = (RTCHitN)auVar79[0x10];
                          local_5b40[0x11] = (RTCHitN)auVar79[0x11];
                          local_5b40[0x12] = (RTCHitN)auVar79[0x12];
                          local_5b40[0x13] = (RTCHitN)auVar79[0x13];
                          local_5b40[0x14] = (RTCHitN)auVar79[0x14];
                          local_5b40[0x15] = (RTCHitN)auVar79[0x15];
                          local_5b40[0x16] = (RTCHitN)auVar79[0x16];
                          local_5b40[0x17] = (RTCHitN)auVar79[0x17];
                          local_5b40[0x18] = (RTCHitN)auVar79[0x18];
                          local_5b40[0x19] = (RTCHitN)auVar79[0x19];
                          local_5b40[0x1a] = (RTCHitN)auVar79[0x1a];
                          local_5b40[0x1b] = (RTCHitN)auVar79[0x1b];
                          local_5b40[0x1c] = (RTCHitN)auVar79[0x1c];
                          local_5b40[0x1d] = (RTCHitN)auVar79[0x1d];
                          local_5b40[0x1e] = (RTCHitN)auVar79[0x1e];
                          local_5b40[0x1f] = (RTCHitN)auVar79[0x1f];
                          auVar160._8_8_ = 0;
                          auVar160._0_8_ = *(ulong *)(lVar60 + 0x48);
                          auVar79 = vpmovzxbd_avx2(auVar160);
                          auVar79 = vcvtdq2ps_avx(auVar79);
                          auVar116 = vfmadd213ps_fma(auVar79,auVar91,auVar94);
                          local_5a20 = ZEXT1632(auVar116);
                          auVar77._8_8_ = 0;
                          auVar77._0_8_ = *(ulong *)(lVar60 + 0x50);
                          auVar79 = vpmovzxbd_avx2(auVar77);
                          uVar72 = *(undefined4 *)(lVar60 + 0x80);
                          auVar92._4_4_ = uVar72;
                          auVar92._0_4_ = uVar72;
                          auVar92._8_4_ = uVar72;
                          auVar92._12_4_ = uVar72;
                          auVar92._16_4_ = uVar72;
                          auVar92._20_4_ = uVar72;
                          auVar92._24_4_ = uVar72;
                          auVar92._28_4_ = uVar72;
                          auVar79 = vcvtdq2ps_avx(auVar79);
                          uVar72 = *(undefined4 *)(lVar60 + 0x74);
                          auVar95._4_4_ = uVar72;
                          auVar95._0_4_ = uVar72;
                          auVar95._8_4_ = uVar72;
                          auVar95._12_4_ = uVar72;
                          auVar95._16_4_ = uVar72;
                          auVar95._20_4_ = uVar72;
                          auVar95._24_4_ = uVar72;
                          auVar95._28_4_ = uVar72;
                          auVar116 = vfmadd213ps_fma(auVar79,auVar92,auVar95);
                          auVar79 = ZEXT1632(auVar116);
                          local_5e80.valid = (int *)auVar79._0_8_;
                          local_5e80.geometryUserPtr = (void *)auVar79._8_8_;
                          local_5e80.context = (RTCRayQueryContext *)auVar79._16_8_;
                          local_5e80.ray = (RTCRayN *)auVar79._24_8_;
                          auVar4._8_8_ = 0;
                          auVar4._0_8_ = *(ulong *)(lVar60 + 0x58);
                          auVar79 = vpmovzxbd_avx2(auVar4);
                          auVar79 = vcvtdq2ps_avx(auVar79);
                          auVar116 = vfmadd213ps_fma(auVar79,auVar92,auVar95);
                          local_5e00 = ZEXT1632(auVar116);
                          auVar5._8_8_ = 0;
                          auVar5._0_8_ = *(ulong *)(lVar60 + 0x60);
                          auVar79 = vpmovzxbd_avx2(auVar5);
                          uVar72 = *(undefined4 *)(lVar60 + 0x84);
                          auVar93._4_4_ = uVar72;
                          auVar93._0_4_ = uVar72;
                          auVar93._8_4_ = uVar72;
                          auVar93._12_4_ = uVar72;
                          auVar93._16_4_ = uVar72;
                          auVar93._20_4_ = uVar72;
                          auVar93._24_4_ = uVar72;
                          auVar93._28_4_ = uVar72;
                          uVar72 = *(undefined4 *)(lVar60 + 0x78);
                          auVar97._4_4_ = uVar72;
                          auVar97._0_4_ = uVar72;
                          auVar97._8_4_ = uVar72;
                          auVar97._12_4_ = uVar72;
                          auVar97._16_4_ = uVar72;
                          auVar97._20_4_ = uVar72;
                          auVar97._24_4_ = uVar72;
                          auVar97._28_4_ = uVar72;
                          auVar79 = vcvtdq2ps_avx(auVar79);
                          auVar116 = vfmadd213ps_fma(auVar79,auVar93,auVar97);
                          local_5d60 = ZEXT1632(auVar116);
                          auVar6._8_8_ = 0;
                          auVar6._0_8_ = *(ulong *)(lVar60 + 0x68);
                          auVar79 = vpmovzxbd_avx2(auVar6);
                          lVar66 = 0;
                          for (uVar59 = uVar65; (uVar59 & 1) == 0;
                              uVar59 = uVar59 >> 1 | 0x8000000000000000) {
                            lVar66 = lVar66 + 1;
                          }
                          auVar79 = vcvtdq2ps_avx(auVar79);
                          auVar116 = vfmadd213ps_fma(auVar79,auVar93,auVar97);
                          local_5d80 = ZEXT1632(auVar116);
                          uVar59 = (ulong)(uint)((int)lVar66 * 4);
                          uVar72 = *(undefined4 *)(local_5b40 + uVar59);
                          auVar117._4_4_ = uVar72;
                          auVar117._0_4_ = uVar72;
                          auVar117._8_4_ = uVar72;
                          auVar117._12_4_ = uVar72;
                          auVar117._16_4_ = uVar72;
                          auVar117._20_4_ = uVar72;
                          auVar117._24_4_ = uVar72;
                          auVar117._28_4_ = uVar72;
                          auVar52._8_8_ = local_5d00._8_8_;
                          auVar52._0_8_ = local_5d00._0_8_;
                          auVar52._16_8_ = local_5d00._16_8_;
                          auVar52._24_8_ = local_5d00._24_8_;
                          auVar53._8_8_ = local_5d00._40_8_;
                          auVar53._0_8_ = local_5d00._32_8_;
                          auVar53._16_8_ = local_5d00._48_8_;
                          auVar53._24_8_ = local_5d00._56_8_;
                          auVar54._8_8_ = local_5d00._72_8_;
                          auVar54._0_8_ = local_5d00._64_8_;
                          auVar54._16_8_ = local_5d00._80_8_;
                          auVar54._24_8_ = local_5d00._88_8_;
                          auVar79 = vsubps_avx(auVar117,auVar52);
                          auVar102._4_4_ = (float)local_5c40._4_4_ * auVar79._4_4_;
                          auVar102._0_4_ = (float)local_5c40._0_4_ * auVar79._0_4_;
                          auVar102._8_4_ = fStack_5c38 * auVar79._8_4_;
                          auVar102._12_4_ = fStack_5c34 * auVar79._12_4_;
                          auVar102._16_4_ = fStack_5c30 * auVar79._16_4_;
                          auVar102._20_4_ = fStack_5c2c * auVar79._20_4_;
                          auVar102._24_4_ = fStack_5c28 * auVar79._24_4_;
                          auVar102._28_4_ = auVar79._28_4_;
                          uVar72 = *(undefined4 *)((long)&local_5e80.valid + uVar59);
                          auVar132._4_4_ = uVar72;
                          auVar132._0_4_ = uVar72;
                          auVar132._8_4_ = uVar72;
                          auVar132._12_4_ = uVar72;
                          auVar132._16_4_ = uVar72;
                          auVar132._20_4_ = uVar72;
                          auVar132._24_4_ = uVar72;
                          auVar132._28_4_ = uVar72;
                          auVar79 = vsubps_avx(auVar132,auVar53);
                          auVar103._4_4_ = (float)local_5c20._4_4_ * auVar79._4_4_;
                          auVar103._0_4_ = (float)local_5c20._0_4_ * auVar79._0_4_;
                          auVar103._8_4_ = fStack_5c18 * auVar79._8_4_;
                          auVar103._12_4_ = fStack_5c14 * auVar79._12_4_;
                          auVar103._16_4_ = fStack_5c10 * auVar79._16_4_;
                          auVar103._20_4_ = fStack_5c0c * auVar79._20_4_;
                          auVar103._24_4_ = fStack_5c08 * auVar79._24_4_;
                          auVar103._28_4_ = auVar79._28_4_;
                          uVar72 = *(undefined4 *)(local_5d60 + uVar59);
                          auVar135._4_4_ = uVar72;
                          auVar135._0_4_ = uVar72;
                          auVar135._8_4_ = uVar72;
                          auVar135._12_4_ = uVar72;
                          auVar135._16_4_ = uVar72;
                          auVar135._20_4_ = uVar72;
                          auVar135._24_4_ = uVar72;
                          auVar135._28_4_ = uVar72;
                          auVar79 = vsubps_avx(auVar135,auVar54);
                          in_ZMM8 = ZEXT3264(local_5c00);
                          auVar104._4_4_ = local_5c00._4_4_ * auVar79._4_4_;
                          auVar104._0_4_ = local_5c00._0_4_ * auVar79._0_4_;
                          auVar104._8_4_ = local_5c00._8_4_ * auVar79._8_4_;
                          auVar104._12_4_ = local_5c00._12_4_ * auVar79._12_4_;
                          auVar104._16_4_ = local_5c00._16_4_ * auVar79._16_4_;
                          auVar104._20_4_ = local_5c00._20_4_ * auVar79._20_4_;
                          auVar104._24_4_ = local_5c00._24_4_ * auVar79._24_4_;
                          auVar104._28_4_ = auVar79._28_4_;
                          uVar72 = *(undefined4 *)(local_5a20 + uVar59);
                          auVar145._4_4_ = uVar72;
                          auVar145._0_4_ = uVar72;
                          auVar145._8_4_ = uVar72;
                          auVar145._12_4_ = uVar72;
                          auVar145._16_4_ = uVar72;
                          auVar145._20_4_ = uVar72;
                          auVar145._24_4_ = uVar72;
                          auVar145._28_4_ = uVar72;
                          auVar79 = vsubps_avx(auVar145,auVar52);
                          auVar32._4_4_ = (float)local_5c40._4_4_ * auVar79._4_4_;
                          auVar32._0_4_ = (float)local_5c40._0_4_ * auVar79._0_4_;
                          auVar32._8_4_ = fStack_5c38 * auVar79._8_4_;
                          auVar32._12_4_ = fStack_5c34 * auVar79._12_4_;
                          auVar32._16_4_ = fStack_5c30 * auVar79._16_4_;
                          auVar32._20_4_ = fStack_5c2c * auVar79._20_4_;
                          auVar32._24_4_ = fStack_5c28 * auVar79._24_4_;
                          auVar32._28_4_ = auVar79._28_4_;
                          uVar72 = *(undefined4 *)(local_5e00 + uVar59);
                          auVar129._4_4_ = uVar72;
                          auVar129._0_4_ = uVar72;
                          auVar129._8_4_ = uVar72;
                          auVar129._12_4_ = uVar72;
                          auVar129._16_4_ = uVar72;
                          auVar129._20_4_ = uVar72;
                          auVar129._24_4_ = uVar72;
                          auVar129._28_4_ = uVar72;
                          auVar79 = vsubps_avx(auVar129,auVar53);
                          auVar33._4_4_ = (float)local_5c20._4_4_ * auVar79._4_4_;
                          auVar33._0_4_ = (float)local_5c20._0_4_ * auVar79._0_4_;
                          auVar33._8_4_ = fStack_5c18 * auVar79._8_4_;
                          auVar33._12_4_ = fStack_5c14 * auVar79._12_4_;
                          auVar33._16_4_ = fStack_5c10 * auVar79._16_4_;
                          auVar33._20_4_ = fStack_5c0c * auVar79._20_4_;
                          auVar33._24_4_ = fStack_5c08 * auVar79._24_4_;
                          auVar33._28_4_ = auVar79._28_4_;
                          uVar72 = *(undefined4 *)(local_5d80 + uVar59);
                          auVar130._4_4_ = uVar72;
                          auVar130._0_4_ = uVar72;
                          auVar130._8_4_ = uVar72;
                          auVar130._12_4_ = uVar72;
                          auVar130._16_4_ = uVar72;
                          auVar130._20_4_ = uVar72;
                          auVar130._24_4_ = uVar72;
                          auVar130._28_4_ = uVar72;
                          auVar79 = vsubps_avx(auVar130,auVar54);
                          auVar34._4_4_ = local_5c00._4_4_ * auVar79._4_4_;
                          auVar34._0_4_ = local_5c00._0_4_ * auVar79._0_4_;
                          auVar34._8_4_ = local_5c00._8_4_ * auVar79._8_4_;
                          auVar34._12_4_ = local_5c00._12_4_ * auVar79._12_4_;
                          auVar34._16_4_ = local_5c00._16_4_ * auVar79._16_4_;
                          auVar34._20_4_ = local_5c00._20_4_ * auVar79._20_4_;
                          auVar34._24_4_ = local_5c00._24_4_ * auVar79._24_4_;
                          auVar34._28_4_ = auVar79._28_4_;
                          auVar79 = vminps_avx(auVar102,auVar32);
                          auVar80 = vminps_avx(auVar103,auVar33);
                          auVar79 = vmaxps_avx(auVar79,auVar80);
                          auVar80 = vminps_avx(auVar104,auVar34);
                          auVar134 = ZEXT3264(auVar80);
                          auVar79 = vmaxps_avx(auVar79,auVar80);
                          auVar81 = vmulps_avx512vl(auVar79,auVar165._0_32_);
                          auVar79 = vmaxps_avx(auVar102,auVar32);
                          auVar80 = vmaxps_avx(auVar103,auVar33);
                          auVar80 = vminps_avx(auVar79,auVar80);
                          auVar79 = vmaxps_avx(auVar104,auVar34);
                          auVar79 = vminps_avx(auVar80,auVar79);
                          auVar80 = vmulps_avx512vl(auVar79,auVar166._0_32_);
                          auVar79 = vmaxps_avx(auVar81,local_5b80);
                          auVar55._4_4_ = uStack_5b5c;
                          auVar55._0_4_ = local_5b60;
                          auVar55._8_4_ = uStack_5b58;
                          auVar55._12_4_ = uStack_5b54;
                          auVar55._16_4_ = uStack_5b50;
                          auVar55._20_4_ = uStack_5b4c;
                          auVar55._24_4_ = uStack_5b48;
                          auVar55._28_4_ = uStack_5b44;
                          auVar80 = vminps_avx(auVar80,auVar55);
                          uVar26 = vcmpps_avx512vl(auVar79,auVar80,2);
                          if ((bVar61 & (byte)uVar26) == 0) {
                            bVar74 = false;
                          }
                          else {
                            local_5da8 = uVar65;
                            uVar7 = *(ushort *)(lVar60 + lVar66 * 8);
                            uVar8 = *(ushort *)(lVar60 + 2 + lVar66 * 8);
                            uVar75 = CONCAT44(0,*(uint *)(lVar60 + 4 + lVar66 * 8));
                            local_5e40._0_8_ = uVar75;
                            pGVar67 = (context->scene->geometries).items[*(uint *)(lVar60 + 0x88)].
                                      ptr;
                            lVar66 = *(long *)&pGVar67->field_0x58;
                            lVar10 = *(long *)&pGVar67[1].time_range.upper;
                            local_5e08 = uVar75 * pGVar67[1].super_RefCount.refCounter.
                                                  super___atomic_base<unsigned_long>._M_i;
                            local_5e94 = uVar7 & 0x7fff;
                            local_5e98 = uVar8 & 0x7fff;
                            uVar9 = *(uint *)(lVar66 + 4 + local_5e08);
                            uVar65 = (ulong)uVar9;
                            uVar59 = (ulong)(uVar9 * local_5e98 +
                                            *(int *)(lVar66 + local_5e08) + local_5e94);
                            p_Var11 = pGVar67[1].intersectionFilterN;
                            puVar1 = (undefined8 *)(lVar10 + (uVar59 + 1) * (long)p_Var11);
                            local_5a20._16_8_ = *puVar1;
                            local_5a20._24_8_ = puVar1[1];
                            lVar60 = uVar59 + uVar65;
                            puVar1 = (undefined8 *)(lVar10 + lVar60 * (long)p_Var11);
                            local_59f0 = *puVar1;
                            uStack_59e8 = puVar1[1];
                            lVar68 = uVar59 + uVar65 + 1;
                            puVar1 = (undefined8 *)(lVar10 + lVar68 * (long)p_Var11);
                            local_5a00 = *puVar1;
                            uStack_59f8 = puVar1[1];
                            uVar75 = (ulong)(-1 < (short)uVar7);
                            puVar1 = (undefined8 *)(lVar10 + (uVar59 + uVar75 + 1) * (long)p_Var11);
                            lVar62 = uVar75 + lVar68;
                            puVar2 = (undefined8 *)(lVar10 + lVar62 * (long)p_Var11);
                            local_59c0 = *puVar2;
                            uStack_59b8 = puVar2[1];
                            if ((short)uVar8 < 0) {
                              uVar65 = 0;
                            }
                            puVar2 = (undefined8 *)(lVar10 + (lVar60 + uVar65) * (long)p_Var11);
                            puVar3 = (undefined8 *)(lVar10 + (lVar68 + uVar65) * (long)p_Var11);
                            local_5980 = *puVar3;
                            uStack_5978 = puVar3[1];
                            puVar3 = (undefined8 *)(lVar10 + (uVar65 + lVar62) * (long)p_Var11);
                            local_5d30 = vpbroadcastd_avx512vl();
                            local_5a20._0_16_ =
                                 *(undefined1 (*) [16])(lVar10 + (long)p_Var11 * uVar59);
                            local_59e0 = local_5a20._16_8_;
                            uStack_59d8 = local_5a20._24_8_;
                            local_59d0 = *puVar1;
                            uStack_59c8 = puVar1[1];
                            local_59b0 = local_5a00;
                            uStack_59a8 = uStack_59f8;
                            local_59a0 = local_59f0;
                            uStack_5998 = uStack_59e8;
                            local_5990 = local_5a00;
                            uStack_5988 = uStack_59f8;
                            local_5970 = *puVar2;
                            uStack_5968 = puVar2[1];
                            local_5960 = local_5a00;
                            uStack_5958 = uStack_59f8;
                            local_5950 = local_59c0;
                            uStack_5948 = uStack_59b8;
                            local_5940 = *puVar3;
                            uStack_5938 = puVar3[1];
                            local_5930 = local_5980;
                            uStack_5928 = uStack_5978;
                            local_5d40 = vpbroadcastd_avx512vl();
                            puVar63 = (uint *)&uStack_59e8;
                            uVar75 = 0;
                            ray = local_5ea8;
                            bVar64 = bVar61;
                            local_5ea0 = lVar66;
                            do {
                              uVar9 = puVar63[-0xe];
                              auVar118._4_4_ = uVar9;
                              auVar118._0_4_ = uVar9;
                              auVar118._8_4_ = uVar9;
                              auVar118._12_4_ = uVar9;
                              auVar118._16_4_ = uVar9;
                              auVar118._20_4_ = uVar9;
                              auVar118._24_4_ = uVar9;
                              auVar118._28_4_ = uVar9;
                              uVar9 = puVar63[-0xd];
                              auVar123._4_4_ = uVar9;
                              auVar123._0_4_ = uVar9;
                              auVar123._8_4_ = uVar9;
                              auVar123._12_4_ = uVar9;
                              auVar123._16_4_ = uVar9;
                              auVar123._20_4_ = uVar9;
                              auVar123._24_4_ = uVar9;
                              auVar123._28_4_ = uVar9;
                              uVar9 = puVar63[-0xc];
                              auVar126._4_4_ = uVar9;
                              auVar126._0_4_ = uVar9;
                              auVar126._8_4_ = uVar9;
                              auVar126._12_4_ = uVar9;
                              auVar126._16_4_ = uVar9;
                              auVar126._20_4_ = uVar9;
                              auVar126._24_4_ = uVar9;
                              auVar126._28_4_ = uVar9;
                              uVar9 = puVar63[-10];
                              local_5da0._4_4_ = uVar9;
                              local_5da0._0_4_ = uVar9;
                              local_5da0._8_4_ = uVar9;
                              local_5da0._12_4_ = uVar9;
                              local_5da0._16_4_ = uVar9;
                              local_5da0._20_4_ = uVar9;
                              local_5da0._24_4_ = uVar9;
                              local_5da0._28_4_ = uVar9;
                              uVar9 = puVar63[-9];
                              local_5840._4_4_ = uVar9;
                              local_5840._0_4_ = uVar9;
                              local_5840._8_4_ = uVar9;
                              local_5840._12_4_ = uVar9;
                              local_5840._16_4_ = uVar9;
                              local_5840._20_4_ = uVar9;
                              local_5840._24_4_ = uVar9;
                              local_5840._28_4_ = uVar9;
                              uVar9 = puVar63[-8];
                              local_5860._4_4_ = uVar9;
                              local_5860._0_4_ = uVar9;
                              local_5860._8_4_ = uVar9;
                              local_5860._12_4_ = uVar9;
                              local_5860._16_4_ = uVar9;
                              local_5860._20_4_ = uVar9;
                              local_5860._24_4_ = uVar9;
                              local_5860._28_4_ = uVar9;
                              uVar9 = puVar63[-2];
                              local_5880._4_4_ = uVar9;
                              local_5880._0_4_ = uVar9;
                              local_5880._8_4_ = uVar9;
                              local_5880._12_4_ = uVar9;
                              local_5880._16_4_ = uVar9;
                              local_5880._20_4_ = uVar9;
                              local_5880._24_4_ = uVar9;
                              local_5880._28_4_ = uVar9;
                              local_58a0 = vbroadcastss_avx512vl(ZEXT416(puVar63[-1]));
                              local_58c0 = vbroadcastss_avx512vl(ZEXT416(*puVar63));
                              local_5d60._0_16_ = local_5d40;
                              local_5d80._0_16_ = local_5d30;
                              auVar79 = *(undefined1 (*) [32])ray;
                              auVar80 = *(undefined1 (*) [32])(ray + 0x20);
                              auVar81 = *(undefined1 (*) [32])(ray + 0x40);
                              auVar82 = *(undefined1 (*) [32])(ray + 0x80);
                              auVar83 = *(undefined1 (*) [32])(ray + 0xa0);
                              in_ZMM10 = ZEXT3264(auVar83);
                              auVar107 = *(undefined1 (*) [32])(ray + 0xc0);
                              auVar108 = vsubps_avx(auVar118,auVar79);
                              auVar101 = vsubps_avx(auVar123,auVar80);
                              auVar25 = vsubps_avx(auVar126,auVar81);
                              auVar96 = vsubps_avx(local_5da0,auVar79);
                              auVar84 = vsubps_avx512vl(local_5840,auVar80);
                              auVar85 = vsubps_avx512vl(local_5860,auVar81);
                              auVar86 = vsubps_avx512vl(local_5880,auVar79);
                              auVar87 = vsubps_avx512vl(local_58a0,auVar80);
                              auVar81 = vsubps_avx512vl(local_58c0,auVar81);
                              auVar88 = vsubps_avx512vl(auVar86,auVar108);
                              auVar89 = vsubps_avx512vl(auVar87,auVar101);
                              auVar80 = vsubps_avx(auVar81,auVar25);
                              auVar90 = vsubps_avx512vl(auVar108,auVar96);
                              auVar91 = vsubps_avx512vl(auVar101,auVar84);
                              auVar92 = vsubps_avx512vl(auVar25,auVar85);
                              auVar93 = vaddps_avx512vl(auVar86,auVar108);
                              auVar94 = vaddps_avx512vl(auVar87,auVar101);
                              auVar127._0_4_ = auVar25._0_4_ + auVar81._0_4_;
                              auVar127._4_4_ = auVar25._4_4_ + auVar81._4_4_;
                              auVar127._8_4_ = auVar25._8_4_ + auVar81._8_4_;
                              auVar127._12_4_ = auVar25._12_4_ + auVar81._12_4_;
                              auVar127._16_4_ = auVar25._16_4_ + auVar81._16_4_;
                              auVar127._20_4_ = auVar25._20_4_ + auVar81._20_4_;
                              auVar127._24_4_ = auVar25._24_4_ + auVar81._24_4_;
                              auVar127._28_4_ = auVar25._28_4_ + auVar81._28_4_;
                              auVar35._4_4_ = auVar80._4_4_ * auVar94._4_4_;
                              auVar35._0_4_ = auVar80._0_4_ * auVar94._0_4_;
                              auVar35._8_4_ = auVar80._8_4_ * auVar94._8_4_;
                              auVar35._12_4_ = auVar80._12_4_ * auVar94._12_4_;
                              auVar35._16_4_ = auVar80._16_4_ * auVar94._16_4_;
                              auVar35._20_4_ = auVar80._20_4_ * auVar94._20_4_;
                              auVar35._24_4_ = auVar80._24_4_ * auVar94._24_4_;
                              auVar35._28_4_ = auVar79._28_4_;
                              auVar122 = vfmsub231ps_fma(auVar35,auVar89,auVar127);
                              auVar36._4_4_ = auVar88._4_4_ * auVar127._4_4_;
                              auVar36._0_4_ = auVar88._0_4_ * auVar127._0_4_;
                              auVar36._8_4_ = auVar88._8_4_ * auVar127._8_4_;
                              auVar36._12_4_ = auVar88._12_4_ * auVar127._12_4_;
                              auVar36._16_4_ = auVar88._16_4_ * auVar127._16_4_;
                              auVar36._20_4_ = auVar88._20_4_ * auVar127._20_4_;
                              auVar36._24_4_ = auVar88._24_4_ * auVar127._24_4_;
                              auVar36._28_4_ = auVar127._28_4_;
                              auVar116 = vfmsub231ps_fma(auVar36,auVar80,auVar93);
                              auVar37._4_4_ = auVar89._4_4_ * auVar93._4_4_;
                              auVar37._0_4_ = auVar89._0_4_ * auVar93._0_4_;
                              auVar37._8_4_ = auVar89._8_4_ * auVar93._8_4_;
                              auVar37._12_4_ = auVar89._12_4_ * auVar93._12_4_;
                              auVar37._16_4_ = auVar89._16_4_ * auVar93._16_4_;
                              auVar37._20_4_ = auVar89._20_4_ * auVar93._20_4_;
                              auVar37._24_4_ = auVar89._24_4_ * auVar93._24_4_;
                              auVar37._28_4_ = auVar93._28_4_;
                              auVar78 = vfmsub231ps_fma(auVar37,auVar88,auVar94);
                              fVar109 = auVar107._0_4_;
                              auVar119._0_4_ = fVar109 * auVar78._0_4_;
                              fVar110 = auVar107._4_4_;
                              auVar119._4_4_ = fVar110 * auVar78._4_4_;
                              fVar111 = auVar107._8_4_;
                              auVar119._8_4_ = fVar111 * auVar78._8_4_;
                              fVar112 = auVar107._12_4_;
                              auVar119._12_4_ = fVar112 * auVar78._12_4_;
                              fVar113 = auVar107._16_4_;
                              auVar119._16_4_ = fVar113 * 0.0;
                              fVar114 = auVar107._20_4_;
                              auVar119._20_4_ = fVar114 * 0.0;
                              fVar159 = auVar107._24_4_;
                              auVar119._24_4_ = fVar159 * 0.0;
                              auVar119._28_4_ = 0;
                              auVar116 = vfmadd231ps_fma(auVar119,auVar83,ZEXT1632(auVar116));
                              auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar82,
                                                         ZEXT1632(auVar122));
                              auVar124._0_4_ = auVar108._0_4_ + auVar96._0_4_;
                              auVar124._4_4_ = auVar108._4_4_ + auVar96._4_4_;
                              auVar124._8_4_ = auVar108._8_4_ + auVar96._8_4_;
                              auVar124._12_4_ = auVar108._12_4_ + auVar96._12_4_;
                              auVar124._16_4_ = auVar108._16_4_ + auVar96._16_4_;
                              auVar124._20_4_ = auVar108._20_4_ + auVar96._20_4_;
                              auVar124._24_4_ = auVar108._24_4_ + auVar96._24_4_;
                              auVar124._28_4_ = auVar108._28_4_ + auVar96._28_4_;
                              auVar79 = vaddps_avx512vl(auVar101,auVar84);
                              auVar93 = vaddps_avx512vl(auVar25,auVar85);
                              auVar94 = vmulps_avx512vl(auVar79,auVar92);
                              auVar94 = vfmsub231ps_avx512vl(auVar94,auVar91,auVar93);
                              auVar93 = vmulps_avx512vl(auVar93,auVar90);
                              auVar93 = vfmsub231ps_avx512vl(auVar93,auVar92,auVar124);
                              auVar95 = vmulps_avx512vl(auVar124,auVar91);
                              auVar79 = vfmsub231ps_avx512vl(auVar95,auVar90,auVar79);
                              auVar95 = vsubps_avx512vl(auVar96,auVar86);
                              auVar38._4_4_ = fVar110 * auVar79._4_4_;
                              auVar38._0_4_ = fVar109 * auVar79._0_4_;
                              auVar38._8_4_ = fVar111 * auVar79._8_4_;
                              auVar38._12_4_ = fVar112 * auVar79._12_4_;
                              auVar38._16_4_ = fVar113 * auVar79._16_4_;
                              auVar38._20_4_ = fVar114 * auVar79._20_4_;
                              auVar38._24_4_ = fVar159 * auVar79._24_4_;
                              auVar38._28_4_ = auVar79._28_4_;
                              auVar79 = vfmadd231ps_avx512vl(auVar38,auVar83,auVar93);
                              auVar93 = vsubps_avx512vl(auVar84,auVar87);
                              auVar122 = vfmadd231ps_fma(auVar79,auVar82,auVar94);
                              auVar79 = vsubps_avx512vl(auVar85,auVar81);
                              auVar96 = vaddps_avx512vl(auVar96,auVar86);
                              auVar84 = vaddps_avx512vl(auVar84,auVar87);
                              auVar81 = vaddps_avx512vl(auVar85,auVar81);
                              auVar85 = vmulps_avx512vl(auVar84,auVar79);
                              auVar85 = vfmsub231ps_avx512vl(auVar85,auVar93,auVar81);
                              auVar39._4_4_ = auVar81._4_4_ * auVar95._4_4_;
                              auVar39._0_4_ = auVar81._0_4_ * auVar95._0_4_;
                              auVar39._8_4_ = auVar81._8_4_ * auVar95._8_4_;
                              auVar39._12_4_ = auVar81._12_4_ * auVar95._12_4_;
                              auVar39._16_4_ = auVar81._16_4_ * auVar95._16_4_;
                              auVar39._20_4_ = auVar81._20_4_ * auVar95._20_4_;
                              auVar39._24_4_ = auVar81._24_4_ * auVar95._24_4_;
                              auVar39._28_4_ = auVar81._28_4_;
                              auVar78 = vfmsub231ps_fma(auVar39,auVar79,auVar96);
                              auVar40._4_4_ = auVar96._4_4_ * auVar93._4_4_;
                              auVar40._0_4_ = auVar96._0_4_ * auVar93._0_4_;
                              auVar40._8_4_ = auVar96._8_4_ * auVar93._8_4_;
                              auVar40._12_4_ = auVar96._12_4_ * auVar93._12_4_;
                              auVar40._16_4_ = auVar96._16_4_ * auVar93._16_4_;
                              auVar40._20_4_ = auVar96._20_4_ * auVar93._20_4_;
                              auVar40._24_4_ = auVar96._24_4_ * auVar93._24_4_;
                              auVar40._28_4_ = auVar96._28_4_;
                              auVar81 = vfmsub231ps_avx512vl(auVar40,auVar95,auVar84);
                              auVar81 = vmulps_avx512vl(auVar81,auVar107);
                              auVar81 = vfmadd231ps_avx512vl(auVar81,auVar83,ZEXT1632(auVar78));
                              auVar81 = vfmadd231ps_avx512vl(auVar81,auVar82,auVar85);
                              fVar156 = auVar122._0_4_;
                              fVar115 = auVar116._0_4_;
                              fVar148 = auVar122._4_4_;
                              fVar120 = auVar116._4_4_;
                              fVar157 = auVar122._8_4_;
                              fVar121 = auVar116._8_4_;
                              fVar158 = auVar122._12_4_;
                              fVar76 = auVar116._12_4_;
                              auVar96 = vaddps_avx512vl(auVar81,ZEXT1632(CONCAT412(fVar76 + fVar158,
                                                                                   CONCAT48(fVar121 
                                                  + fVar157,
                                                  CONCAT44(fVar120 + fVar148,fVar115 + fVar156)))));
                              auVar87 = auVar162._0_32_;
                              vandps_avx512vl(auVar96,auVar87);
                              auVar134 = ZEXT3264(auVar96);
                              auVar84 = vmulps_avx512vl(auVar96,auVar167._0_32_);
                              auVar85 = vminps_avx512vl(ZEXT1632(auVar116),ZEXT1632(auVar122));
                              auVar85 = vminps_avx512vl(auVar85,auVar81);
                              auVar86 = vxorps_avx512vl(auVar84,auVar161._0_32_);
                              uVar26 = vcmpps_avx512vl(auVar85,auVar86,5);
                              auVar85 = vmaxps_avx512vl(ZEXT1632(auVar116),ZEXT1632(auVar122));
                              auVar81 = vmaxps_avx512vl(auVar85,auVar81);
                              local_58e0 = vbroadcastss_avx512vl(ZEXT416(puVar63[-6]));
                              uVar27 = vcmpps_avx512vl(auVar81,auVar84,2);
                              local_5900 = vbroadcastss_avx512vl(ZEXT416(puVar63[-5]));
                              local_5920 = vbroadcastss_avx512vl(ZEXT416(puVar63[-4]));
                              bVar71 = ((byte)uVar26 | (byte)uVar27) & bVar64;
                              local_5e40._0_8_ = uVar75;
                              if (bVar71 == 0) {
LAB_007d3753:
                                in_ZMM8 = ZEXT3264(auVar101);
                                bVar71 = bVar64;
                              }
                              else {
                                auVar81 = vmulps_avx512vl(auVar91,auVar80);
                                auVar84 = vmulps_avx512vl(auVar88,auVar92);
                                auVar85 = vmulps_avx512vl(auVar90,auVar89);
                                auVar86 = vmulps_avx512vl(auVar93,auVar92);
                                auVar94 = vmulps_avx512vl(auVar90,auVar79);
                                auVar97 = vmulps_avx512vl(auVar95,auVar91);
                                auVar89 = vfmsub213ps_avx512vl(auVar89,auVar92,auVar81);
                                auVar80 = vfmsub213ps_avx512vl(auVar80,auVar90,auVar84);
                                auVar88 = vfmsub213ps_avx512vl(auVar88,auVar91,auVar85);
                                auVar79 = vfmsub213ps_avx512vl(auVar79,auVar91,auVar86);
                                auVar92 = vfmsub213ps_avx512vl(auVar95,auVar92,auVar94);
                                auVar90 = vfmsub213ps_avx512vl(auVar93,auVar90,auVar97);
                                vandps_avx512vl(auVar81,auVar87);
                                vandps_avx512vl(auVar86,auVar87);
                                uVar65 = vcmpps_avx512vl(auVar90,auVar90,1);
                                vandps_avx512vl(auVar84,auVar87);
                                vandps_avx512vl(auVar94,auVar87);
                                uVar59 = vcmpps_avx512vl(auVar90,auVar90,1);
                                vandps_avx512vl(auVar85,auVar87);
                                vandps_avx512vl(auVar97,auVar87);
                                uVar28 = vcmpps_avx512vl(auVar90,auVar90,1);
                                bVar74 = (bool)((byte)uVar65 & 1);
                                auVar98._0_4_ =
                                     (uint)bVar74 * auVar89._0_4_ | (uint)!bVar74 * auVar79._0_4_;
                                bVar74 = (bool)((byte)(uVar65 >> 1) & 1);
                                auVar98._4_4_ =
                                     (uint)bVar74 * auVar89._4_4_ | (uint)!bVar74 * auVar79._4_4_;
                                bVar74 = (bool)((byte)(uVar65 >> 2) & 1);
                                auVar98._8_4_ =
                                     (uint)bVar74 * auVar89._8_4_ | (uint)!bVar74 * auVar79._8_4_;
                                bVar74 = (bool)((byte)(uVar65 >> 3) & 1);
                                auVar98._12_4_ =
                                     (uint)bVar74 * auVar89._12_4_ | (uint)!bVar74 * auVar79._12_4_;
                                bVar74 = (bool)((byte)(uVar65 >> 4) & 1);
                                auVar98._16_4_ =
                                     (uint)bVar74 * auVar89._16_4_ | (uint)!bVar74 * auVar79._16_4_;
                                bVar74 = (bool)((byte)(uVar65 >> 5) & 1);
                                auVar98._20_4_ =
                                     (uint)bVar74 * auVar89._20_4_ | (uint)!bVar74 * auVar79._20_4_;
                                bVar74 = (bool)((byte)(uVar65 >> 6) & 1);
                                auVar98._24_4_ =
                                     (uint)bVar74 * auVar89._24_4_ | (uint)!bVar74 * auVar79._24_4_;
                                bVar74 = SUB81(uVar65 >> 7,0);
                                auVar98._28_4_ =
                                     (uint)bVar74 * auVar89._28_4_ | (uint)!bVar74 * auVar79._28_4_;
                                bVar74 = (bool)((byte)uVar59 & 1);
                                auVar99._0_4_ =
                                     (uint)bVar74 * auVar80._0_4_ | (uint)!bVar74 * auVar92._0_4_;
                                bVar74 = (bool)((byte)(uVar59 >> 1) & 1);
                                auVar99._4_4_ =
                                     (uint)bVar74 * auVar80._4_4_ | (uint)!bVar74 * auVar92._4_4_;
                                bVar74 = (bool)((byte)(uVar59 >> 2) & 1);
                                auVar99._8_4_ =
                                     (uint)bVar74 * auVar80._8_4_ | (uint)!bVar74 * auVar92._8_4_;
                                bVar74 = (bool)((byte)(uVar59 >> 3) & 1);
                                auVar99._12_4_ =
                                     (uint)bVar74 * auVar80._12_4_ | (uint)!bVar74 * auVar92._12_4_;
                                bVar74 = (bool)((byte)(uVar59 >> 4) & 1);
                                auVar99._16_4_ =
                                     (uint)bVar74 * auVar80._16_4_ | (uint)!bVar74 * auVar92._16_4_;
                                bVar74 = (bool)((byte)(uVar59 >> 5) & 1);
                                auVar99._20_4_ =
                                     (uint)bVar74 * auVar80._20_4_ | (uint)!bVar74 * auVar92._20_4_;
                                bVar74 = (bool)((byte)(uVar59 >> 6) & 1);
                                auVar99._24_4_ =
                                     (uint)bVar74 * auVar80._24_4_ | (uint)!bVar74 * auVar92._24_4_;
                                bVar74 = SUB81(uVar59 >> 7,0);
                                auVar99._28_4_ =
                                     (uint)bVar74 * auVar80._28_4_ | (uint)!bVar74 * auVar92._28_4_;
                                bVar74 = (bool)((byte)uVar28 & 1);
                                auVar100._0_4_ =
                                     (float)((uint)bVar74 * auVar88._0_4_ |
                                            (uint)!bVar74 * auVar90._0_4_);
                                bVar74 = (bool)((byte)(uVar28 >> 1) & 1);
                                auVar100._4_4_ =
                                     (float)((uint)bVar74 * auVar88._4_4_ |
                                            (uint)!bVar74 * auVar90._4_4_);
                                bVar74 = (bool)((byte)(uVar28 >> 2) & 1);
                                auVar100._8_4_ =
                                     (float)((uint)bVar74 * auVar88._8_4_ |
                                            (uint)!bVar74 * auVar90._8_4_);
                                bVar74 = (bool)((byte)(uVar28 >> 3) & 1);
                                auVar100._12_4_ =
                                     (float)((uint)bVar74 * auVar88._12_4_ |
                                            (uint)!bVar74 * auVar90._12_4_);
                                bVar74 = (bool)((byte)(uVar28 >> 4) & 1);
                                auVar100._16_4_ =
                                     (float)((uint)bVar74 * auVar88._16_4_ |
                                            (uint)!bVar74 * auVar90._16_4_);
                                bVar74 = (bool)((byte)(uVar28 >> 5) & 1);
                                auVar100._20_4_ =
                                     (float)((uint)bVar74 * auVar88._20_4_ |
                                            (uint)!bVar74 * auVar90._20_4_);
                                bVar74 = (bool)((byte)(uVar28 >> 6) & 1);
                                auVar100._24_4_ =
                                     (float)((uint)bVar74 * auVar88._24_4_ |
                                            (uint)!bVar74 * auVar90._24_4_);
                                bVar74 = SUB81(uVar28 >> 7,0);
                                auVar100._28_4_ =
                                     (uint)bVar74 * auVar88._28_4_ | (uint)!bVar74 * auVar90._28_4_;
                                auVar41._4_4_ = fVar110 * auVar100._4_4_;
                                auVar41._0_4_ = fVar109 * auVar100._0_4_;
                                auVar41._8_4_ = fVar111 * auVar100._8_4_;
                                auVar41._12_4_ = fVar112 * auVar100._12_4_;
                                auVar41._16_4_ = fVar113 * auVar100._16_4_;
                                auVar41._20_4_ = fVar114 * auVar100._20_4_;
                                auVar41._24_4_ = fVar159 * auVar100._24_4_;
                                auVar41._28_4_ = auVar107._28_4_;
                                auVar116 = vfmadd213ps_fma(auVar83,auVar99,auVar41);
                                auVar116 = vfmadd213ps_fma(auVar82,auVar98,ZEXT1632(auVar116));
                                auVar81 = ZEXT1632(CONCAT412(auVar116._12_4_ + auVar116._12_4_,
                                                             CONCAT48(auVar116._8_4_ +
                                                                      auVar116._8_4_,
                                                                      CONCAT44(auVar116._4_4_ +
                                                                               auVar116._4_4_,
                                                                               auVar116._0_4_ +
                                                                               auVar116._0_4_))));
                                auVar151._0_4_ = auVar25._0_4_ * auVar100._0_4_;
                                auVar151._4_4_ = auVar25._4_4_ * auVar100._4_4_;
                                auVar151._8_4_ = auVar25._8_4_ * auVar100._8_4_;
                                auVar151._12_4_ = auVar25._12_4_ * auVar100._12_4_;
                                auVar151._16_4_ = auVar25._16_4_ * auVar100._16_4_;
                                auVar151._20_4_ = auVar25._20_4_ * auVar100._20_4_;
                                auVar151._24_4_ = auVar25._24_4_ * auVar100._24_4_;
                                auVar151._28_4_ = 0;
                                auVar116 = vfmadd213ps_fma(auVar101,auVar99,auVar151);
                                auVar122 = vfmadd213ps_fma(auVar108,auVar98,ZEXT1632(auVar116));
                                auVar101 = vrcp14ps_avx512vl(auVar81);
                                auVar80 = vxorps_avx512vl(auVar81,auVar161._0_32_);
                                in_ZMM10 = ZEXT3264(auVar80);
                                auVar82 = auVar163._0_32_;
                                auVar79 = vfnmadd213ps_avx512vl(auVar101,auVar81,auVar82);
                                auVar116 = vfmadd132ps_fma(auVar79,auVar101,auVar101);
                                auVar79 = ZEXT1632(CONCAT412(auVar116._12_4_ *
                                                             (auVar122._12_4_ + auVar122._12_4_),
                                                             CONCAT48(auVar116._8_4_ *
                                                                      (auVar122._8_4_ +
                                                                      auVar122._8_4_),
                                                                      CONCAT44(auVar116._4_4_ *
                                                                               (auVar122._4_4_ +
                                                                               auVar122._4_4_),
                                                                               auVar116._0_4_ *
                                                                               (auVar122._0_4_ +
                                                                               auVar122._0_4_)))));
                                uVar26 = vcmpps_avx512vl(auVar79,*(undefined1 (*) [32])(ray + 0x100)
                                                         ,2);
                                uVar27 = vcmpps_avx512vl(auVar79,*(undefined1 (*) [32])(ray + 0x60),
                                                         0xd);
                                uVar29 = vcmpps_avx512vl(auVar81,auVar80,4);
                                bVar71 = bVar71 & (byte)uVar26 & (byte)uVar27 & (byte)uVar29;
                                if (bVar71 == 0) goto LAB_007d3753;
                                pGVar67 = (context->scene->geometries).items
                                          [*(uint *)(local_5d60 + uVar75 * 4)].ptr;
                                uVar9 = pGVar67->mask;
                                auVar138._4_4_ = uVar9;
                                auVar138._0_4_ = uVar9;
                                auVar138._8_4_ = uVar9;
                                auVar138._12_4_ = uVar9;
                                auVar138._16_4_ = uVar9;
                                auVar138._20_4_ = uVar9;
                                auVar138._24_4_ = uVar9;
                                auVar138._28_4_ = uVar9;
                                in_ZMM8 = ZEXT3264(auVar138);
                                uVar26 = vptestmd_avx512vl(auVar138,*(undefined1 (*) [32])
                                                                     (ray + 0x120));
                                bVar56 = (byte)uVar26 & bVar71;
                                bVar57 = bVar64;
                                if (bVar56 != 0) {
                                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                     (pGVar67->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                    auVar116 = vcvtsi2ss_avx512f(auVar161._0_16_,
                                                                 *(ushort *)
                                                                  (lVar66 + 8 + local_5e08) - 1);
                                    auVar160 = auVar91._0_16_;
                                    auVar122 = vcvtsi2ss_avx512f(auVar160,*(ushort *)
                                                                           (lVar66 + 10 + local_5e08
                                                                           ) - 1);
                                    auVar78 = vcvtsi2ss_avx512f(auVar160,((uint)uVar75 & 1) +
                                                                         local_5e94);
                                    auVar160 = vcvtsi2ss_avx512f(auVar160,((uint)(uVar75 >> 1) &
                                                                          0x7fffffff) + local_5e98);
                                    local_5a80 = vpbroadcastd_avx512vl();
                                    auVar50._12_4_ = 0;
                                    auVar50._0_12_ = ZEXT812(0);
                                    auVar77 = vrcp14ss_avx512f(auVar50 << 0x20,
                                                               ZEXT416(auVar116._0_4_));
                                    auVar116 = vfnmadd213ss_fma(auVar116,auVar77,
                                                                SUB6416(ZEXT464(0x40000000),0));
                                    fVar109 = auVar77._0_4_ * auVar116._0_4_;
                                    fVar110 = auVar78._0_4_;
                                    auVar149._0_4_ = fVar110 * auVar96._0_4_ + fVar115;
                                    auVar149._4_4_ = fVar110 * auVar96._4_4_ + fVar120;
                                    auVar149._8_4_ = fVar110 * auVar96._8_4_ + fVar121;
                                    auVar149._12_4_ = fVar110 * auVar96._12_4_ + fVar76;
                                    auVar153._16_4_ = fVar110 * auVar96._16_4_ + 0.0;
                                    auVar153._0_16_ = auVar149;
                                    auVar153._20_4_ = fVar110 * auVar96._20_4_ + 0.0;
                                    auVar153._24_4_ = fVar110 * auVar96._24_4_ + 0.0;
                                    auVar153._28_4_ = fVar110 + 0.0;
                                    in_ZMM10 = ZEXT3264(auVar153);
                                    auVar140._4_4_ = fVar109;
                                    auVar140._0_4_ = fVar109;
                                    auVar140._8_4_ = fVar109;
                                    auVar140._12_4_ = fVar109;
                                    auVar140._16_4_ = fVar109;
                                    auVar140._20_4_ = fVar109;
                                    auVar140._24_4_ = fVar109;
                                    auVar140._28_4_ = fVar109;
                                    auVar80 = vmulps_avx512vl(auVar153,auVar140);
                                    bVar74 = (bool)(bVar71 >> 1 & 1);
                                    bVar14 = (bool)(bVar71 >> 2 & 1);
                                    bVar16 = (bool)(bVar71 >> 3 & 1);
                                    auVar78 = vrcp14ss_avx512f(auVar50 << 0x20,
                                                               ZEXT416(auVar122._0_4_));
                                    auVar116 = vfnmadd213ss_fma(auVar122,auVar78,
                                                                SUB6416(ZEXT464(0x40000000),0));
                                    fVar109 = auVar78._0_4_ * auVar116._0_4_;
                                    fVar110 = auVar160._0_4_;
                                    auVar146._0_4_ = fVar110 * auVar96._0_4_ + fVar156;
                                    auVar146._4_4_ = fVar110 * auVar96._4_4_ + fVar148;
                                    auVar146._8_4_ = fVar110 * auVar96._8_4_ + fVar157;
                                    auVar146._12_4_ = fVar110 * auVar96._12_4_ + fVar158;
                                    auVar146._16_4_ = fVar110 * auVar96._16_4_ + 0.0;
                                    auVar146._20_4_ = fVar110 * auVar96._20_4_ + 0.0;
                                    auVar146._24_4_ = fVar110 * auVar96._24_4_ + 0.0;
                                    auVar146._28_4_ = fVar110 + 0.0;
                                    auVar136._4_4_ = fVar109;
                                    auVar136._0_4_ = fVar109;
                                    auVar136._8_4_ = fVar109;
                                    auVar136._12_4_ = fVar109;
                                    auVar141._16_4_ = fVar109;
                                    auVar141._0_16_ = auVar136;
                                    auVar141._20_4_ = fVar109;
                                    auVar141._24_4_ = fVar109;
                                    auVar141._28_4_ = fVar109;
                                    in_ZMM8 = ZEXT3264(auVar141);
                                    auVar81 = vmulps_avx512vl(auVar146,auVar141);
                                    bVar13 = (bool)(bVar71 >> 1 & 1);
                                    bVar15 = (bool)(bVar71 >> 2 & 1);
                                    bVar18 = (bool)(bVar71 >> 3 & 1);
                                    auVar31._8_4_ = 0x219392ef;
                                    auVar31._0_8_ = 0x219392ef219392ef;
                                    auVar31._12_4_ = 0x219392ef;
                                    auVar31._16_4_ = 0x219392ef;
                                    auVar31._20_4_ = 0x219392ef;
                                    auVar31._24_4_ = 0x219392ef;
                                    auVar31._28_4_ = 0x219392ef;
                                    uVar65 = vcmpps_avx512vl(auVar96,auVar31,5);
                                    auVar83 = vrcp14ps_avx512vl(auVar96);
                                    auVar134 = ZEXT3264(auVar83);
                                    auVar107 = vfnmadd213ps_avx512vl(auVar96,auVar83,auVar82);
                                    auVar107 = vfmadd132ps_avx512vl(auVar107,auVar83,auVar83);
                                    fVar113 = (float)((uint)((byte)uVar65 & 1) * auVar107._0_4_);
                                    fVar159 = (float)((uint)((byte)(uVar65 >> 1) & 1) *
                                                     auVar107._4_4_);
                                    fVar114 = (float)((uint)((byte)(uVar65 >> 2) & 1) *
                                                     auVar107._8_4_);
                                    fVar112 = (float)((uint)((byte)(uVar65 >> 3) & 1) *
                                                     auVar107._12_4_);
                                    fVar111 = (float)((uint)((byte)(uVar65 >> 4) & 1) *
                                                     auVar107._16_4_);
                                    fVar110 = (float)((uint)((byte)(uVar65 >> 5) & 1) *
                                                     auVar107._20_4_);
                                    fVar109 = (float)((uint)((byte)(uVar65 >> 6) & 1) *
                                                     auVar107._24_4_);
                                    auVar46._4_4_ =
                                         (float)((uint)bVar74 * auVar80._4_4_ |
                                                (uint)!bVar74 * (int)fVar120) * fVar159;
                                    auVar46._0_4_ =
                                         (float)((uint)(bVar71 & 1) * auVar80._0_4_ |
                                                (uint)!(bool)(bVar71 & 1) * (int)fVar115) * fVar113;
                                    auVar46._8_4_ =
                                         (float)((uint)bVar14 * auVar80._8_4_ |
                                                (uint)!bVar14 * (int)fVar121) * fVar114;
                                    auVar46._12_4_ =
                                         (float)((uint)bVar16 * auVar80._12_4_ |
                                                (uint)!bVar16 * (int)fVar76) * fVar112;
                                    auVar46._16_4_ =
                                         (float)((uint)(bVar71 >> 4 & 1) * auVar80._16_4_) * fVar111
                                    ;
                                    auVar46._20_4_ =
                                         (float)((uint)(bVar71 >> 5 & 1) * auVar80._20_4_) * fVar110
                                    ;
                                    auVar46._24_4_ =
                                         (float)((uint)(bVar71 >> 6 & 1) * auVar80._24_4_) * fVar109
                                    ;
                                    auVar46._28_4_ = (uint)(bVar71 >> 7) * auVar80._28_4_;
                                    local_5ae0 = vminps_avx512vl(auVar46,auVar82);
                                    auVar47._4_4_ =
                                         (float)((uint)bVar13 * auVar81._4_4_ |
                                                (uint)!bVar13 * (int)fVar148) * fVar159;
                                    auVar47._0_4_ =
                                         (float)((uint)(bVar71 & 1) * auVar81._0_4_ |
                                                (uint)!(bool)(bVar71 & 1) * (int)fVar156) * fVar113;
                                    auVar47._8_4_ =
                                         (float)((uint)bVar15 * auVar81._8_4_ |
                                                (uint)!bVar15 * (int)fVar157) * fVar114;
                                    auVar47._12_4_ =
                                         (float)((uint)bVar18 * auVar81._12_4_ |
                                                (uint)!bVar18 * (int)fVar158) * fVar112;
                                    auVar47._16_4_ =
                                         (float)((uint)(bVar71 >> 4 & 1) * auVar81._16_4_) * fVar111
                                    ;
                                    auVar47._20_4_ =
                                         (float)((uint)(bVar71 >> 5 & 1) * auVar81._20_4_) * fVar110
                                    ;
                                    auVar47._24_4_ =
                                         (float)((uint)(bVar71 >> 6 & 1) * auVar81._24_4_) * fVar109
                                    ;
                                    auVar47._28_4_ = (uint)(bVar71 >> 7) * auVar81._28_4_;
                                    local_5ac0 = vminps_avx512vl(auVar47,auVar82);
                                    local_5aa0 = vpbroadcastd_avx512vl();
                                    pRVar12 = context->user;
                                    local_5b40[0] = (RTCHitN)(char)auVar98._0_4_;
                                    local_5b40[1] = (RTCHitN)(char)(auVar98._0_4_ >> 8);
                                    local_5b40[2] = (RTCHitN)(char)(auVar98._0_4_ >> 0x10);
                                    local_5b40[3] = (RTCHitN)(char)(auVar98._0_4_ >> 0x18);
                                    local_5b40[4] = (RTCHitN)(char)auVar98._4_4_;
                                    local_5b40[5] = (RTCHitN)(char)(auVar98._4_4_ >> 8);
                                    local_5b40[6] = (RTCHitN)(char)(auVar98._4_4_ >> 0x10);
                                    local_5b40[7] = (RTCHitN)(char)(auVar98._4_4_ >> 0x18);
                                    local_5b40[8] = (RTCHitN)(char)auVar98._8_4_;
                                    local_5b40[9] = (RTCHitN)(char)(auVar98._8_4_ >> 8);
                                    local_5b40[10] = (RTCHitN)(char)(auVar98._8_4_ >> 0x10);
                                    local_5b40[0xb] = (RTCHitN)(char)(auVar98._8_4_ >> 0x18);
                                    local_5b40[0xc] = (RTCHitN)(char)auVar98._12_4_;
                                    local_5b40[0xd] = (RTCHitN)(char)(auVar98._12_4_ >> 8);
                                    local_5b40[0xe] = (RTCHitN)(char)(auVar98._12_4_ >> 0x10);
                                    local_5b40[0xf] = (RTCHitN)(char)(auVar98._12_4_ >> 0x18);
                                    local_5b40[0x10] = (RTCHitN)(char)auVar98._16_4_;
                                    local_5b40[0x11] = (RTCHitN)(char)(auVar98._16_4_ >> 8);
                                    local_5b40[0x12] = (RTCHitN)(char)(auVar98._16_4_ >> 0x10);
                                    local_5b40[0x13] = (RTCHitN)(char)(auVar98._16_4_ >> 0x18);
                                    local_5b40[0x14] = (RTCHitN)(char)auVar98._20_4_;
                                    local_5b40[0x15] = (RTCHitN)(char)(auVar98._20_4_ >> 8);
                                    local_5b40[0x16] = (RTCHitN)(char)(auVar98._20_4_ >> 0x10);
                                    local_5b40[0x17] = (RTCHitN)(char)(auVar98._20_4_ >> 0x18);
                                    local_5b40[0x18] = (RTCHitN)(char)auVar98._24_4_;
                                    local_5b40[0x19] = (RTCHitN)(char)(auVar98._24_4_ >> 8);
                                    local_5b40[0x1a] = (RTCHitN)(char)(auVar98._24_4_ >> 0x10);
                                    local_5b40[0x1b] = (RTCHitN)(char)(auVar98._24_4_ >> 0x18);
                                    local_5b40[0x1c] = (RTCHitN)(char)auVar98._28_4_;
                                    local_5b40[0x1d] = (RTCHitN)(char)(auVar98._28_4_ >> 8);
                                    local_5b40[0x1e] = (RTCHitN)(char)(auVar98._28_4_ >> 0x10);
                                    local_5b40[0x1f] = (RTCHitN)(char)(auVar98._28_4_ >> 0x18);
                                    local_5b20 = auVar99;
                                    _local_5b00 = auVar100;
                                    auVar80 = vpcmpeqd_avx2(local_5ae0,local_5ae0);
                                    local_5e18[1] = auVar80;
                                    *local_5e18 = auVar80;
                                    local_5a60 = pRVar12->instID[0];
                                    uStack_5a5c = local_5a60;
                                    uStack_5a58 = local_5a60;
                                    uStack_5a54 = local_5a60;
                                    uStack_5a50 = local_5a60;
                                    uStack_5a4c = local_5a60;
                                    uStack_5a48 = local_5a60;
                                    uStack_5a44 = local_5a60;
                                    local_5a40 = pRVar12->instPrimID[0];
                                    uStack_5a3c = local_5a40;
                                    uStack_5a38 = local_5a40;
                                    uStack_5a34 = local_5a40;
                                    uStack_5a30 = local_5a40;
                                    uStack_5a2c = local_5a40;
                                    uStack_5a28 = local_5a40;
                                    uStack_5a24 = local_5a40;
                                    local_5d20 = *(undefined1 (*) [32])(ray + 0x100);
                                    auVar79 = vblendmps_avx512vl(local_5d20,auVar79);
                                    bVar74 = (bool)(bVar56 >> 1 & 1);
                                    bVar13 = (bool)(bVar56 >> 2 & 1);
                                    bVar14 = (bool)(bVar56 >> 3 & 1);
                                    bVar15 = (bool)(bVar56 >> 4 & 1);
                                    bVar16 = (bool)(bVar56 >> 5 & 1);
                                    bVar18 = (bool)(bVar56 >> 6 & 1);
                                    *(uint *)(ray + 0x100) =
                                         (uint)(bVar56 & 1) * auVar79._0_4_ |
                                         !(bool)(bVar56 & 1) * local_5a40;
                                    *(uint *)(ray + 0x104) =
                                         (uint)bVar74 * auVar79._4_4_ | !bVar74 * local_5a40;
                                    *(uint *)(ray + 0x108) =
                                         (uint)bVar13 * auVar79._8_4_ | !bVar13 * local_5a40;
                                    *(uint *)(ray + 0x10c) =
                                         (uint)bVar14 * auVar79._12_4_ | !bVar14 * local_5a40;
                                    *(uint *)(ray + 0x110) =
                                         (uint)bVar15 * auVar79._16_4_ | !bVar15 * local_5a40;
                                    *(uint *)(ray + 0x114) =
                                         (uint)bVar16 * auVar79._20_4_ | !bVar16 * local_5a40;
                                    *(uint *)(ray + 0x118) =
                                         (uint)bVar18 * auVar79._24_4_ | !bVar18 * local_5a40;
                                    *(uint *)(ray + 0x11c) =
                                         (uint)(bVar56 >> 7) * auVar79._28_4_ |
                                         !(bool)(bVar56 >> 7) * local_5a40;
                                    local_5e00 = vpmovm2d_avx512vl((ulong)bVar56);
                                    local_5e80.geometryUserPtr = pGVar67->userPtr;
                                    local_5e80.valid = (int *)local_5e00;
                                    local_5e80.context = context->user;
                                    local_5e80.ray = (RTCRayN *)ray;
                                    local_5e80.hit = local_5b40;
                                    local_5e80.N = 8;
                                    if (pGVar67->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                      auVar134 = ZEXT1664(auVar83._0_16_);
                                      in_ZMM8 = ZEXT1664(auVar136);
                                      in_ZMM10 = ZEXT1664(auVar149);
                                      local_5dc8 = pGVar67;
                                      (*pGVar67->occlusionFilterN)(&local_5e80);
                                      auVar79 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                      auVar161 = ZEXT3264(auVar79);
                                      auVar79 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                      auVar167 = ZEXT3264(auVar79);
                                      auVar79 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                      auVar166 = ZEXT3264(auVar79);
                                      auVar79 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                      auVar165 = ZEXT3264(auVar79);
                                      auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                      auVar164 = ZEXT3264(auVar79);
                                      auVar79 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                      auVar163 = ZEXT3264(auVar79);
                                      auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                      auVar162 = ZEXT3264(auVar79);
                                      uVar75 = local_5e40._0_8_;
                                      lVar66 = local_5ea0;
                                      pGVar67 = local_5dc8;
                                      ray = local_5ea8;
                                    }
                                    if (local_5e00 == (undefined1  [32])0x0) {
                                      uVar65 = 0;
                                    }
                                    else {
                                      p_Var11 = context->args->filter;
                                      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                                         (((context->args->flags &
                                           RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                          (((pGVar67->field_8).field_0x2 & 0x40) != 0)))) {
                                        auVar134 = ZEXT1664(auVar134._0_16_);
                                        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
                                        in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
                                        (*p_Var11)(&local_5e80);
                                        auVar79 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                        auVar161 = ZEXT3264(auVar79);
                                        auVar79 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                        auVar167 = ZEXT3264(auVar79);
                                        auVar79 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                        auVar166 = ZEXT3264(auVar79);
                                        auVar79 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                        auVar165 = ZEXT3264(auVar79);
                                        auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                        auVar164 = ZEXT3264(auVar79);
                                        auVar79 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                        auVar163 = ZEXT3264(auVar79);
                                        auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                        auVar162 = ZEXT3264(auVar79);
                                        uVar75 = local_5e40._0_8_;
                                        lVar66 = local_5ea0;
                                        ray = local_5ea8;
                                      }
                                      uVar65 = vptestmd_avx512vl(local_5e00,local_5e00);
                                      auVar79 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                      bVar74 = (bool)((byte)uVar65 & 1);
                                      bVar13 = (bool)((byte)(uVar65 >> 1) & 1);
                                      bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
                                      bVar15 = (bool)((byte)(uVar65 >> 3) & 1);
                                      bVar16 = (bool)((byte)(uVar65 >> 4) & 1);
                                      bVar18 = (bool)((byte)(uVar65 >> 5) & 1);
                                      bVar21 = (bool)((byte)(uVar65 >> 6) & 1);
                                      bVar24 = SUB81(uVar65 >> 7,0);
                                      *(uint *)(local_5e80.ray + 0x100) =
                                           (uint)bVar74 * auVar79._0_4_ |
                                           (uint)!bVar74 * *(int *)(local_5e80.ray + 0x100);
                                      *(uint *)(local_5e80.ray + 0x104) =
                                           (uint)bVar13 * auVar79._4_4_ |
                                           (uint)!bVar13 * *(int *)(local_5e80.ray + 0x104);
                                      *(uint *)(local_5e80.ray + 0x108) =
                                           (uint)bVar14 * auVar79._8_4_ |
                                           (uint)!bVar14 * *(int *)(local_5e80.ray + 0x108);
                                      *(uint *)(local_5e80.ray + 0x10c) =
                                           (uint)bVar15 * auVar79._12_4_ |
                                           (uint)!bVar15 * *(int *)(local_5e80.ray + 0x10c);
                                      *(uint *)(local_5e80.ray + 0x110) =
                                           (uint)bVar16 * auVar79._16_4_ |
                                           (uint)!bVar16 * *(int *)(local_5e80.ray + 0x110);
                                      *(uint *)(local_5e80.ray + 0x114) =
                                           (uint)bVar18 * auVar79._20_4_ |
                                           (uint)!bVar18 * *(int *)(local_5e80.ray + 0x114);
                                      *(uint *)(local_5e80.ray + 0x118) =
                                           (uint)bVar21 * auVar79._24_4_ |
                                           (uint)!bVar21 * *(int *)(local_5e80.ray + 0x118);
                                      *(uint *)(local_5e80.ray + 0x11c) =
                                           (uint)bVar24 * auVar79._28_4_ |
                                           (uint)!bVar24 * *(int *)(local_5e80.ray + 0x11c);
                                    }
                                    bVar56 = (byte)uVar65;
                                    bVar74 = (bool)((byte)(uVar65 >> 1) & 1);
                                    bVar13 = (bool)((byte)(uVar65 >> 2) & 1);
                                    bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
                                    bVar15 = (bool)((byte)(uVar65 >> 4) & 1);
                                    bVar16 = (bool)((byte)(uVar65 >> 5) & 1);
                                    bVar18 = (bool)((byte)(uVar65 >> 6) & 1);
                                    bVar21 = (bool)((byte)(uVar65 >> 7) & 1);
                                    *(uint *)local_5e90 =
                                         (uint)(bVar56 & 1) * *(int *)local_5e90 |
                                         (uint)!(bool)(bVar56 & 1) * local_5d20._0_4_;
                                    *(uint *)(local_5e90 + 4) =
                                         (uint)bVar74 * *(int *)(local_5e90 + 4) |
                                         (uint)!bVar74 * local_5d20._4_4_;
                                    *(uint *)(local_5e90 + 8) =
                                         (uint)bVar13 * *(int *)(local_5e90 + 8) |
                                         (uint)!bVar13 * local_5d20._8_4_;
                                    *(uint *)(local_5e90 + 0xc) =
                                         (uint)bVar14 * *(int *)(local_5e90 + 0xc) |
                                         (uint)!bVar14 * local_5d20._12_4_;
                                    *(uint *)(local_5e90 + 0x10) =
                                         (uint)bVar15 * *(int *)(local_5e90 + 0x10) |
                                         (uint)!bVar15 * local_5d20._16_4_;
                                    *(uint *)(local_5e90 + 0x14) =
                                         (uint)bVar16 * *(int *)(local_5e90 + 0x14) |
                                         (uint)!bVar16 * local_5d20._20_4_;
                                    *(uint *)(local_5e90 + 0x18) =
                                         (uint)bVar18 * *(int *)(local_5e90 + 0x18) |
                                         (uint)!bVar18 * local_5d20._24_4_;
                                    *(uint *)(local_5e90 + 0x1c) =
                                         (uint)bVar21 * *(int *)(local_5e90 + 0x1c) |
                                         (uint)!bVar21 * local_5d20._28_4_;
                                  }
                                  bVar57 = ~bVar56 & bVar64;
                                }
                                bVar71 = bVar71 ^ bVar64;
                                bVar64 = bVar57;
                              }
                              if (bVar71 != 0) {
                                auVar79 = *(undefined1 (*) [32])ray;
                                auVar80 = *(undefined1 (*) [32])(ray + 0x20);
                                auVar81 = *(undefined1 (*) [32])(ray + 0x40);
                                auVar82 = *(undefined1 (*) [32])(ray + 0x80);
                                auVar83 = *(undefined1 (*) [32])(ray + 0xa0);
                                in_ZMM10 = ZEXT3264(auVar83);
                                auVar107 = *(undefined1 (*) [32])(ray + 0xc0);
                                auVar108 = vsubps_avx(local_58e0,auVar79);
                                auVar101 = vsubps_avx(local_5900,auVar80);
                                in_ZMM8 = ZEXT3264(auVar101);
                                auVar25 = vsubps_avx(local_5920,auVar81);
                                auVar96 = vsubps_avx(local_5880,auVar79);
                                auVar84 = vsubps_avx(local_58a0,auVar80);
                                auVar85 = vsubps_avx512vl(local_58c0,auVar81);
                                auVar79 = vsubps_avx512vl(local_5da0,auVar79);
                                auVar80 = vsubps_avx512vl(local_5840,auVar80);
                                auVar81 = vsubps_avx512vl(local_5860,auVar81);
                                auVar86 = vsubps_avx512vl(auVar79,auVar108);
                                auVar87 = vsubps_avx512vl(auVar80,auVar101);
                                auVar88 = vsubps_avx512vl(auVar81,auVar25);
                                auVar89 = vsubps_avx512vl(auVar108,auVar96);
                                auVar90 = vsubps_avx512vl(auVar101,auVar84);
                                auVar91 = vsubps_avx512vl(auVar25,auVar85);
                                auVar92 = vsubps_avx512vl(auVar96,auVar79);
                                auVar93 = vsubps_avx512vl(auVar84,auVar80);
                                auVar94 = vsubps_avx512vl(auVar85,auVar81);
                                auVar95 = vaddps_avx512vl(auVar79,auVar108);
                                auVar97 = vaddps_avx512vl(auVar80,auVar101);
                                auVar102 = vaddps_avx512vl(auVar81,auVar25);
                                auVar103 = vmulps_avx512vl(auVar97,auVar88);
                                auVar103 = vfmsub231ps_avx512vl(auVar103,auVar87,auVar102);
                                auVar102 = vmulps_avx512vl(auVar102,auVar86);
                                auVar102 = vfmsub231ps_avx512vl(auVar102,auVar88,auVar95);
                                auVar42._4_4_ = auVar87._4_4_ * auVar95._4_4_;
                                auVar42._0_4_ = auVar87._0_4_ * auVar95._0_4_;
                                auVar42._8_4_ = auVar87._8_4_ * auVar95._8_4_;
                                auVar42._12_4_ = auVar87._12_4_ * auVar95._12_4_;
                                auVar42._16_4_ = auVar87._16_4_ * auVar95._16_4_;
                                auVar42._20_4_ = auVar87._20_4_ * auVar95._20_4_;
                                auVar42._24_4_ = auVar87._24_4_ * auVar95._24_4_;
                                auVar42._28_4_ = auVar95._28_4_;
                                auVar116 = vfmsub231ps_fma(auVar42,auVar86,auVar97);
                                fVar156 = auVar107._0_4_;
                                auVar128._0_4_ = fVar156 * auVar116._0_4_;
                                fVar148 = auVar107._4_4_;
                                auVar128._4_4_ = fVar148 * auVar116._4_4_;
                                fVar157 = auVar107._8_4_;
                                auVar128._8_4_ = fVar157 * auVar116._8_4_;
                                fVar158 = auVar107._12_4_;
                                auVar128._12_4_ = fVar158 * auVar116._12_4_;
                                fVar115 = auVar107._16_4_;
                                auVar128._16_4_ = fVar115 * 0.0;
                                fVar120 = auVar107._20_4_;
                                auVar128._20_4_ = fVar120 * 0.0;
                                fVar121 = auVar107._24_4_;
                                auVar128._24_4_ = fVar121 * 0.0;
                                auVar128._28_4_ = 0;
                                auVar95 = vfmadd231ps_avx512vl(auVar128,auVar83,auVar102);
                                auVar95 = vfmadd231ps_avx512vl(auVar95,auVar82,auVar103);
                                auVar131._0_4_ = auVar108._0_4_ + auVar96._0_4_;
                                auVar131._4_4_ = auVar108._4_4_ + auVar96._4_4_;
                                auVar131._8_4_ = auVar108._8_4_ + auVar96._8_4_;
                                auVar131._12_4_ = auVar108._12_4_ + auVar96._12_4_;
                                auVar131._16_4_ = auVar108._16_4_ + auVar96._16_4_;
                                auVar131._20_4_ = auVar108._20_4_ + auVar96._20_4_;
                                auVar131._24_4_ = auVar108._24_4_ + auVar96._24_4_;
                                auVar131._28_4_ = auVar108._28_4_ + auVar96._28_4_;
                                auVar97 = vaddps_avx512vl(auVar101,auVar84);
                                auVar102 = vaddps_avx512vl(auVar25,auVar85);
                                auVar103 = vmulps_avx512vl(auVar97,auVar91);
                                auVar103 = vfmsub231ps_avx512vl(auVar103,auVar90,auVar102);
                                auVar102 = vmulps_avx512vl(auVar102,auVar89);
                                auVar102 = vfmsub231ps_avx512vl(auVar102,auVar91,auVar131);
                                auVar104 = vmulps_avx512vl(auVar131,auVar90);
                                auVar97 = vfmsub231ps_avx512vl(auVar104,auVar89,auVar97);
                                auVar43._4_4_ = fVar148 * auVar97._4_4_;
                                auVar43._0_4_ = fVar156 * auVar97._0_4_;
                                auVar43._8_4_ = fVar157 * auVar97._8_4_;
                                auVar43._12_4_ = fVar158 * auVar97._12_4_;
                                auVar43._16_4_ = fVar115 * auVar97._16_4_;
                                auVar43._20_4_ = fVar120 * auVar97._20_4_;
                                auVar43._24_4_ = fVar121 * auVar97._24_4_;
                                auVar43._28_4_ = auVar97._28_4_;
                                auVar97 = vfmadd231ps_avx512vl(auVar43,auVar83,auVar102);
                                auVar97 = vfmadd231ps_avx512vl(auVar97,auVar82,auVar103);
                                auVar102 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar161 = ZEXT3264(auVar102);
                                auVar79 = vaddps_avx512vl(auVar96,auVar79);
                                auVar80 = vaddps_avx512vl(auVar84,auVar80);
                                auVar81 = vaddps_avx512vl(auVar85,auVar81);
                                auVar96 = vmulps_avx512vl(auVar80,auVar94);
                                auVar96 = vfmsub231ps_avx512vl(auVar96,auVar93,auVar81);
                                auVar81 = vmulps_avx512vl(auVar81,auVar92);
                                auVar81 = vfmsub231ps_avx512vl(auVar81,auVar94,auVar79);
                                auVar44._4_4_ = auVar79._4_4_ * auVar93._4_4_;
                                auVar44._0_4_ = auVar79._0_4_ * auVar93._0_4_;
                                auVar44._8_4_ = auVar79._8_4_ * auVar93._8_4_;
                                auVar44._12_4_ = auVar79._12_4_ * auVar93._12_4_;
                                auVar44._16_4_ = auVar79._16_4_ * auVar93._16_4_;
                                auVar44._20_4_ = auVar79._20_4_ * auVar93._20_4_;
                                auVar44._24_4_ = auVar79._24_4_ * auVar93._24_4_;
                                auVar44._28_4_ = auVar79._28_4_;
                                auVar116 = vfmsub231ps_fma(auVar44,auVar92,auVar80);
                                auVar79 = vmulps_avx512vl(ZEXT1632(auVar116),auVar107);
                                auVar79 = vfmadd231ps_avx512vl(auVar79,auVar83,auVar81);
                                auVar79 = vfmadd231ps_avx512vl(auVar79,auVar82,auVar96);
                                auVar133._0_4_ = auVar95._0_4_ + auVar97._0_4_;
                                auVar133._4_4_ = auVar95._4_4_ + auVar97._4_4_;
                                auVar133._8_4_ = auVar95._8_4_ + auVar97._8_4_;
                                auVar133._12_4_ = auVar95._12_4_ + auVar97._12_4_;
                                auVar133._16_4_ = auVar95._16_4_ + auVar97._16_4_;
                                auVar133._20_4_ = auVar95._20_4_ + auVar97._20_4_;
                                auVar133._24_4_ = auVar95._24_4_ + auVar97._24_4_;
                                auVar133._28_4_ = auVar95._28_4_ + auVar97._28_4_;
                                auVar80 = vaddps_avx512vl(auVar79,auVar133);
                                auVar85 = auVar162._0_32_;
                                vandps_avx512vl(auVar80,auVar85);
                                auVar134 = ZEXT3264(auVar80);
                                auVar81 = vmulps_avx512vl(auVar80,auVar167._0_32_);
                                auVar96 = vminps_avx512vl(auVar95,auVar97);
                                auVar96 = vminps_avx512vl(auVar96,auVar79);
                                auVar84 = vxorps_avx512vl(auVar81,auVar102);
                                uVar26 = vcmpps_avx512vl(auVar96,auVar84,5);
                                auVar96 = vmaxps_avx512vl(auVar95,auVar97);
                                auVar79 = vmaxps_avx512vl(auVar96,auVar79);
                                uVar27 = vcmpps_avx512vl(auVar79,auVar81,2);
                                bVar71 = ((byte)uVar26 | (byte)uVar27) & bVar64;
                                if (bVar71 != 0) {
                                  auVar79 = vmulps_avx512vl(auVar90,auVar88);
                                  auVar81 = vmulps_avx512vl(auVar86,auVar91);
                                  auVar96 = vmulps_avx512vl(auVar89,auVar87);
                                  auVar84 = vmulps_avx512vl(auVar93,auVar91);
                                  auVar103 = vmulps_avx512vl(auVar89,auVar94);
                                  auVar104 = vmulps_avx512vl(auVar92,auVar90);
                                  auVar87 = vfmsub213ps_avx512vl(auVar87,auVar91,auVar79);
                                  auVar88 = vfmsub213ps_avx512vl(auVar88,auVar89,auVar81);
                                  auVar86 = vfmsub213ps_avx512vl(auVar86,auVar90,auVar96);
                                  auVar94 = vfmsub213ps_avx512vl(auVar94,auVar90,auVar84);
                                  auVar91 = vfmsub213ps_avx512vl(auVar92,auVar91,auVar103);
                                  auVar89 = vfmsub213ps_avx512vl(auVar93,auVar89,auVar104);
                                  vandps_avx512vl(auVar79,auVar85);
                                  vandps_avx512vl(auVar84,auVar85);
                                  uVar65 = vcmpps_avx512vl(auVar89,auVar89,1);
                                  vandps_avx512vl(auVar81,auVar85);
                                  vandps_avx512vl(auVar103,auVar85);
                                  uVar59 = vcmpps_avx512vl(auVar89,auVar89,1);
                                  vandps_avx512vl(auVar96,auVar85);
                                  vandps_avx512vl(auVar104,auVar85);
                                  uVar28 = vcmpps_avx512vl(auVar89,auVar89,1);
                                  bVar74 = (bool)((byte)uVar65 & 1);
                                  auVar105._0_4_ =
                                       (uint)bVar74 * auVar87._0_4_ | (uint)!bVar74 * auVar94._0_4_;
                                  bVar74 = (bool)((byte)(uVar65 >> 1) & 1);
                                  auVar105._4_4_ =
                                       (uint)bVar74 * auVar87._4_4_ | (uint)!bVar74 * auVar94._4_4_;
                                  bVar74 = (bool)((byte)(uVar65 >> 2) & 1);
                                  auVar105._8_4_ =
                                       (uint)bVar74 * auVar87._8_4_ | (uint)!bVar74 * auVar94._8_4_;
                                  bVar74 = (bool)((byte)(uVar65 >> 3) & 1);
                                  auVar105._12_4_ =
                                       (uint)bVar74 * auVar87._12_4_ |
                                       (uint)!bVar74 * auVar94._12_4_;
                                  bVar74 = (bool)((byte)(uVar65 >> 4) & 1);
                                  auVar105._16_4_ =
                                       (uint)bVar74 * auVar87._16_4_ |
                                       (uint)!bVar74 * auVar94._16_4_;
                                  bVar74 = (bool)((byte)(uVar65 >> 5) & 1);
                                  auVar105._20_4_ =
                                       (uint)bVar74 * auVar87._20_4_ |
                                       (uint)!bVar74 * auVar94._20_4_;
                                  bVar74 = (bool)((byte)(uVar65 >> 6) & 1);
                                  auVar105._24_4_ =
                                       (uint)bVar74 * auVar87._24_4_ |
                                       (uint)!bVar74 * auVar94._24_4_;
                                  bVar74 = SUB81(uVar65 >> 7,0);
                                  auVar105._28_4_ =
                                       (uint)bVar74 * auVar87._28_4_ |
                                       (uint)!bVar74 * auVar94._28_4_;
                                  bVar74 = (bool)((byte)uVar59 & 1);
                                  auVar106._0_4_ =
                                       (uint)bVar74 * auVar88._0_4_ | (uint)!bVar74 * auVar91._0_4_;
                                  bVar74 = (bool)((byte)(uVar59 >> 1) & 1);
                                  auVar106._4_4_ =
                                       (uint)bVar74 * auVar88._4_4_ | (uint)!bVar74 * auVar91._4_4_;
                                  bVar74 = (bool)((byte)(uVar59 >> 2) & 1);
                                  auVar106._8_4_ =
                                       (uint)bVar74 * auVar88._8_4_ | (uint)!bVar74 * auVar91._8_4_;
                                  bVar74 = (bool)((byte)(uVar59 >> 3) & 1);
                                  auVar106._12_4_ =
                                       (uint)bVar74 * auVar88._12_4_ |
                                       (uint)!bVar74 * auVar91._12_4_;
                                  bVar74 = (bool)((byte)(uVar59 >> 4) & 1);
                                  auVar106._16_4_ =
                                       (uint)bVar74 * auVar88._16_4_ |
                                       (uint)!bVar74 * auVar91._16_4_;
                                  bVar74 = (bool)((byte)(uVar59 >> 5) & 1);
                                  auVar106._20_4_ =
                                       (uint)bVar74 * auVar88._20_4_ |
                                       (uint)!bVar74 * auVar91._20_4_;
                                  bVar74 = (bool)((byte)(uVar59 >> 6) & 1);
                                  auVar106._24_4_ =
                                       (uint)bVar74 * auVar88._24_4_ |
                                       (uint)!bVar74 * auVar91._24_4_;
                                  bVar74 = SUB81(uVar59 >> 7,0);
                                  auVar106._28_4_ =
                                       (uint)bVar74 * auVar88._28_4_ |
                                       (uint)!bVar74 * auVar91._28_4_;
                                  bVar74 = (bool)((byte)uVar28 & 1);
                                  fVar76 = (float)((uint)bVar74 * auVar86._0_4_ |
                                                  (uint)!bVar74 * auVar89._0_4_);
                                  bVar74 = (bool)((byte)(uVar28 >> 1) & 1);
                                  fVar109 = (float)((uint)bVar74 * auVar86._4_4_ |
                                                   (uint)!bVar74 * auVar89._4_4_);
                                  bVar74 = (bool)((byte)(uVar28 >> 2) & 1);
                                  fVar110 = (float)((uint)bVar74 * auVar86._8_4_ |
                                                   (uint)!bVar74 * auVar89._8_4_);
                                  bVar74 = (bool)((byte)(uVar28 >> 3) & 1);
                                  fVar111 = (float)((uint)bVar74 * auVar86._12_4_ |
                                                   (uint)!bVar74 * auVar89._12_4_);
                                  bVar74 = (bool)((byte)(uVar28 >> 4) & 1);
                                  fVar112 = (float)((uint)bVar74 * auVar86._16_4_ |
                                                   (uint)!bVar74 * auVar89._16_4_);
                                  bVar74 = (bool)((byte)(uVar28 >> 5) & 1);
                                  fVar113 = (float)((uint)bVar74 * auVar86._20_4_ |
                                                   (uint)!bVar74 * auVar89._20_4_);
                                  bVar74 = (bool)((byte)(uVar28 >> 6) & 1);
                                  fVar114 = (float)((uint)bVar74 * auVar86._24_4_ |
                                                   (uint)!bVar74 * auVar89._24_4_);
                                  bVar74 = SUB81(uVar28 >> 7,0);
                                  auVar45._4_4_ = fVar148 * fVar109;
                                  auVar45._0_4_ = fVar156 * fVar76;
                                  auVar45._8_4_ = fVar157 * fVar110;
                                  auVar45._12_4_ = fVar158 * fVar111;
                                  auVar45._16_4_ = fVar115 * fVar112;
                                  auVar45._20_4_ = fVar120 * fVar113;
                                  auVar45._24_4_ = fVar121 * fVar114;
                                  auVar45._28_4_ = auVar107._28_4_;
                                  auVar116 = vfmadd213ps_fma(auVar83,auVar106,auVar45);
                                  auVar116 = vfmadd213ps_fma(auVar82,auVar105,ZEXT1632(auVar116));
                                  auVar83 = ZEXT1632(CONCAT412(auVar116._12_4_ + auVar116._12_4_,
                                                               CONCAT48(auVar116._8_4_ +
                                                                        auVar116._8_4_,
                                                                        CONCAT44(auVar116._4_4_ +
                                                                                 auVar116._4_4_,
                                                                                 auVar116._0_4_ +
                                                                                 auVar116._0_4_))));
                                  auVar152._0_4_ = auVar25._0_4_ * fVar76;
                                  auVar152._4_4_ = auVar25._4_4_ * fVar109;
                                  auVar152._8_4_ = auVar25._8_4_ * fVar110;
                                  auVar152._12_4_ = auVar25._12_4_ * fVar111;
                                  auVar152._16_4_ = auVar25._16_4_ * fVar112;
                                  auVar152._20_4_ = auVar25._20_4_ * fVar113;
                                  auVar152._24_4_ = auVar25._24_4_ * fVar114;
                                  auVar152._28_4_ = 0;
                                  auVar116 = vfmadd213ps_fma(auVar101,auVar106,auVar152);
                                  auVar122 = vfmadd213ps_fma(auVar108,auVar105,ZEXT1632(auVar116));
                                  auVar79 = vrcp14ps_avx512vl(auVar83);
                                  in_ZMM8 = ZEXT3264(auVar79);
                                  auVar81 = vxorps_avx512vl(auVar83,auVar102);
                                  in_ZMM10 = ZEXT3264(auVar81);
                                  auVar107 = auVar163._0_32_;
                                  auVar82 = vfnmadd213ps_avx512vl(auVar79,auVar83,auVar107);
                                  auVar116 = vfmadd132ps_fma(auVar82,auVar79,auVar79);
                                  auVar79 = ZEXT1632(CONCAT412(auVar116._12_4_ *
                                                               (auVar122._12_4_ + auVar122._12_4_),
                                                               CONCAT48(auVar116._8_4_ *
                                                                        (auVar122._8_4_ +
                                                                        auVar122._8_4_),
                                                                        CONCAT44(auVar116._4_4_ *
                                                                                 (auVar122._4_4_ +
                                                                                 auVar122._4_4_),
                                                                                 auVar116._0_4_ *
                                                                                 (auVar122._0_4_ +
                                                                                 auVar122._0_4_)))))
                                  ;
                                  uVar26 = vcmpps_avx512vl(auVar79,*(undefined1 (*) [32])
                                                                    (ray + 0x100),2);
                                  uVar27 = vcmpps_avx512vl(auVar79,*(undefined1 (*) [32])
                                                                    (ray + 0x60),0xd);
                                  uVar29 = vcmpps_avx512vl(auVar83,auVar81,4);
                                  bVar71 = bVar71 & (byte)uVar26 & (byte)uVar27 & (byte)uVar29;
                                  if (bVar71 != 0) {
                                    pGVar67 = (context->scene->geometries).items
                                              [*(uint *)(local_5d60 + uVar75 * 4)].ptr;
                                    uVar9 = pGVar67->mask;
                                    auVar139._4_4_ = uVar9;
                                    auVar139._0_4_ = uVar9;
                                    auVar139._8_4_ = uVar9;
                                    auVar139._12_4_ = uVar9;
                                    auVar139._16_4_ = uVar9;
                                    auVar139._20_4_ = uVar9;
                                    auVar139._24_4_ = uVar9;
                                    auVar139._28_4_ = uVar9;
                                    in_ZMM8 = ZEXT3264(auVar139);
                                    uVar26 = vptestmd_avx512vl(auVar139,*(undefined1 (*) [32])
                                                                         (ray + 0x120));
                                    bVar56 = (byte)uVar26 & bVar71;
                                    if (bVar56 != 0) {
                                      uVar75 = local_5e40._0_8_;
                                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                         (pGVar67->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                        auVar78 = auVar162._0_16_;
                                        auVar116 = vcvtsi2ss_avx512f(auVar78,*(ushort *)
                                                                              (lVar66 + 8 +
                                                                              local_5e08) - 1);
                                        auVar122 = vcvtsi2ss_avx512f(auVar78,*(ushort *)
                                                                              (lVar66 + 10 +
                                                                              local_5e08) - 1);
                                        auVar78 = vcvtsi2ss_avx512f(auVar78,(local_5e40._0_4_ & 1) +
                                                                            local_5e94);
                                        auVar160 = vcvtsi2ss_avx512f(auVar90._0_16_,
                                                                     ((uint)((ulong)local_5e40._0_8_
                                                                            >> 1) & 0x7fffffff) +
                                                                     local_5e98);
                                        local_5a80 = vpbroadcastd_avx512vl();
                                        auVar51._12_4_ = 0;
                                        auVar51._0_12_ = ZEXT812(0);
                                        auVar77 = vrcp14ss_avx512f(auVar51 << 0x20,
                                                                   ZEXT416(auVar116._0_4_));
                                        auVar116 = vfnmadd213ss_fma(auVar116,auVar77,
                                                                    SUB6416(ZEXT464(0x40000000),0));
                                        fVar156 = auVar77._0_4_ * auVar116._0_4_;
                                        auVar81 = vsubps_avx(auVar80,auVar95);
                                        fVar148 = auVar78._0_4_;
                                        auVar150._0_4_ = fVar148 * auVar80._0_4_ + auVar81._0_4_;
                                        auVar150._4_4_ = fVar148 * auVar80._4_4_ + auVar81._4_4_;
                                        auVar150._8_4_ = fVar148 * auVar80._8_4_ + auVar81._8_4_;
                                        auVar150._12_4_ = fVar148 * auVar80._12_4_ + auVar81._12_4_;
                                        auVar154._16_4_ = fVar148 * auVar80._16_4_ + auVar81._16_4_;
                                        auVar154._0_16_ = auVar150;
                                        auVar154._20_4_ = fVar148 * auVar80._20_4_ + auVar81._20_4_;
                                        auVar154._24_4_ = fVar148 * auVar80._24_4_ + auVar81._24_4_;
                                        auVar154._28_4_ = fVar148 + auVar81._28_4_;
                                        in_ZMM10 = ZEXT3264(auVar154);
                                        auVar142._4_4_ = fVar156;
                                        auVar142._0_4_ = fVar156;
                                        auVar142._8_4_ = fVar156;
                                        auVar142._12_4_ = fVar156;
                                        auVar142._16_4_ = fVar156;
                                        auVar142._20_4_ = fVar156;
                                        auVar142._24_4_ = fVar156;
                                        auVar142._28_4_ = fVar156;
                                        auVar83 = vmulps_avx512vl(auVar154,auVar142);
                                        bVar13 = (bool)(bVar71 >> 1 & 1);
                                        bVar15 = (bool)(bVar71 >> 2 & 1);
                                        bVar18 = (bool)(bVar71 >> 3 & 1);
                                        bVar24 = (bool)(bVar71 >> 4 & 1);
                                        bVar19 = (bool)(bVar71 >> 5 & 1);
                                        bVar22 = (bool)(bVar71 >> 6 & 1);
                                        auVar78 = vrcp14ss_avx512f(auVar51 << 0x20,
                                                                   ZEXT416(auVar122._0_4_));
                                        auVar116 = vfnmadd213ss_fma(auVar122,auVar78,
                                                                    SUB6416(ZEXT464(0x40000000),0));
                                        fVar156 = auVar78._0_4_ * auVar116._0_4_;
                                        auVar82 = vsubps_avx(auVar80,auVar97);
                                        fVar148 = auVar160._0_4_;
                                        auVar147._0_4_ = fVar148 * auVar80._0_4_ + auVar82._0_4_;
                                        auVar147._4_4_ = fVar148 * auVar80._4_4_ + auVar82._4_4_;
                                        auVar147._8_4_ = fVar148 * auVar80._8_4_ + auVar82._8_4_;
                                        auVar147._12_4_ = fVar148 * auVar80._12_4_ + auVar82._12_4_;
                                        auVar147._16_4_ = fVar148 * auVar80._16_4_ + auVar82._16_4_;
                                        auVar147._20_4_ = fVar148 * auVar80._20_4_ + auVar82._20_4_;
                                        auVar147._24_4_ = fVar148 * auVar80._24_4_ + auVar82._24_4_;
                                        auVar147._28_4_ = fVar148 + auVar82._28_4_;
                                        auVar137._4_4_ = fVar156;
                                        auVar137._0_4_ = fVar156;
                                        auVar137._8_4_ = fVar156;
                                        auVar137._12_4_ = fVar156;
                                        auVar143._16_4_ = fVar156;
                                        auVar143._0_16_ = auVar137;
                                        auVar143._20_4_ = fVar156;
                                        auVar143._24_4_ = fVar156;
                                        auVar143._28_4_ = fVar156;
                                        in_ZMM8 = ZEXT3264(auVar143);
                                        auVar108 = vmulps_avx512vl(auVar147,auVar143);
                                        bVar14 = (bool)(bVar71 >> 1 & 1);
                                        bVar16 = (bool)(bVar71 >> 2 & 1);
                                        bVar21 = (bool)(bVar71 >> 3 & 1);
                                        bVar17 = (bool)(bVar71 >> 4 & 1);
                                        bVar20 = (bool)(bVar71 >> 5 & 1);
                                        bVar23 = (bool)(bVar71 >> 6 & 1);
                                        auVar30._8_4_ = 0x219392ef;
                                        auVar30._0_8_ = 0x219392ef219392ef;
                                        auVar30._12_4_ = 0x219392ef;
                                        auVar30._16_4_ = 0x219392ef;
                                        auVar30._20_4_ = 0x219392ef;
                                        auVar30._24_4_ = 0x219392ef;
                                        auVar30._28_4_ = 0x219392ef;
                                        uVar65 = vcmpps_avx512vl(auVar80,auVar30,5);
                                        auVar101 = vrcp14ps_avx512vl(auVar80);
                                        auVar134 = ZEXT3264(auVar101);
                                        auVar80 = vfnmadd213ps_avx512vl(auVar80,auVar101,auVar107);
                                        auVar80 = vfmadd132ps_avx512vl(auVar80,auVar101,auVar101);
                                        fVar148 = (float)((uint)((byte)uVar65 & 1) * auVar80._0_4_);
                                        fVar157 = (float)((uint)((byte)(uVar65 >> 1) & 1) *
                                                         auVar80._4_4_);
                                        fVar158 = (float)((uint)((byte)(uVar65 >> 2) & 1) *
                                                         auVar80._8_4_);
                                        fVar115 = (float)((uint)((byte)(uVar65 >> 3) & 1) *
                                                         auVar80._12_4_);
                                        fVar120 = (float)((uint)((byte)(uVar65 >> 4) & 1) *
                                                         auVar80._16_4_);
                                        fVar156 = (float)((uint)((byte)(uVar65 >> 5) & 1) *
                                                         auVar80._20_4_);
                                        fVar121 = (float)((uint)((byte)(uVar65 >> 6) & 1) *
                                                         auVar80._24_4_);
                                        auVar48._4_4_ =
                                             (float)((uint)bVar13 * auVar83._4_4_ |
                                                    (uint)!bVar13 * (int)auVar81._4_4_) * fVar157;
                                        auVar48._0_4_ =
                                             (float)((uint)(bVar71 & 1) * auVar83._0_4_ |
                                                    (uint)!(bool)(bVar71 & 1) * (int)auVar81._0_4_)
                                             * fVar148;
                                        auVar48._8_4_ =
                                             (float)((uint)bVar15 * auVar83._8_4_ |
                                                    (uint)!bVar15 * (int)auVar81._8_4_) * fVar158;
                                        auVar48._12_4_ =
                                             (float)((uint)bVar18 * auVar83._12_4_ |
                                                    (uint)!bVar18 * (int)auVar81._12_4_) * fVar115;
                                        auVar48._16_4_ =
                                             (float)((uint)bVar24 * auVar83._16_4_ |
                                                    (uint)!bVar24 * (int)auVar81._16_4_) * fVar120;
                                        auVar48._20_4_ =
                                             (float)((uint)bVar19 * auVar83._20_4_ |
                                                    (uint)!bVar19 * (int)auVar81._20_4_) * fVar156;
                                        auVar48._24_4_ =
                                             (float)((uint)bVar22 * auVar83._24_4_ |
                                                    (uint)!bVar22 * (int)auVar81._24_4_) * fVar121;
                                        auVar48._28_4_ =
                                             (uint)(bVar71 >> 7) * auVar83._28_4_ |
                                             (uint)!(bool)(bVar71 >> 7) * (int)auVar81._28_4_;
                                        local_5ae0 = vminps_avx512vl(auVar48,auVar107);
                                        auVar49._4_4_ =
                                             (float)((uint)bVar14 * auVar108._4_4_ |
                                                    (uint)!bVar14 * (int)auVar82._4_4_) * fVar157;
                                        auVar49._0_4_ =
                                             (float)((uint)(bVar71 & 1) * auVar108._0_4_ |
                                                    (uint)!(bool)(bVar71 & 1) * (int)auVar82._0_4_)
                                             * fVar148;
                                        auVar49._8_4_ =
                                             (float)((uint)bVar16 * auVar108._8_4_ |
                                                    (uint)!bVar16 * (int)auVar82._8_4_) * fVar158;
                                        auVar49._12_4_ =
                                             (float)((uint)bVar21 * auVar108._12_4_ |
                                                    (uint)!bVar21 * (int)auVar82._12_4_) * fVar115;
                                        auVar49._16_4_ =
                                             (float)((uint)bVar17 * auVar108._16_4_ |
                                                    (uint)!bVar17 * (int)auVar82._16_4_) * fVar120;
                                        auVar49._20_4_ =
                                             (float)((uint)bVar20 * auVar108._20_4_ |
                                                    (uint)!bVar20 * (int)auVar82._20_4_) * fVar156;
                                        auVar49._24_4_ =
                                             (float)((uint)bVar23 * auVar108._24_4_ |
                                                    (uint)!bVar23 * (int)auVar82._24_4_) * fVar121;
                                        auVar49._28_4_ =
                                             (uint)(bVar71 >> 7) * auVar108._28_4_ |
                                             (uint)!(bool)(bVar71 >> 7) * (int)auVar82._28_4_;
                                        local_5ac0 = vminps_avx512vl(auVar49,auVar107);
                                        local_5aa0 = vpbroadcastd_avx512vl();
                                        pRVar12 = context->user;
                                        local_5b40[0] = (RTCHitN)(char)auVar105._0_4_;
                                        local_5b40[1] = (RTCHitN)(char)(auVar105._0_4_ >> 8);
                                        local_5b40[2] = (RTCHitN)(char)(auVar105._0_4_ >> 0x10);
                                        local_5b40[3] = (RTCHitN)(char)(auVar105._0_4_ >> 0x18);
                                        local_5b40[4] = (RTCHitN)(char)auVar105._4_4_;
                                        local_5b40[5] = (RTCHitN)(char)(auVar105._4_4_ >> 8);
                                        local_5b40[6] = (RTCHitN)(char)(auVar105._4_4_ >> 0x10);
                                        local_5b40[7] = (RTCHitN)(char)(auVar105._4_4_ >> 0x18);
                                        local_5b40[8] = (RTCHitN)(char)auVar105._8_4_;
                                        local_5b40[9] = (RTCHitN)(char)(auVar105._8_4_ >> 8);
                                        local_5b40[10] = (RTCHitN)(char)(auVar105._8_4_ >> 0x10);
                                        local_5b40[0xb] = (RTCHitN)(char)(auVar105._8_4_ >> 0x18);
                                        local_5b40[0xc] = (RTCHitN)(char)auVar105._12_4_;
                                        local_5b40[0xd] = (RTCHitN)(char)(auVar105._12_4_ >> 8);
                                        local_5b40[0xe] = (RTCHitN)(char)(auVar105._12_4_ >> 0x10);
                                        local_5b40[0xf] = (RTCHitN)(char)(auVar105._12_4_ >> 0x18);
                                        local_5b40[0x10] = (RTCHitN)(char)auVar105._16_4_;
                                        local_5b40[0x11] = (RTCHitN)(char)(auVar105._16_4_ >> 8);
                                        local_5b40[0x12] = (RTCHitN)(char)(auVar105._16_4_ >> 0x10);
                                        local_5b40[0x13] = (RTCHitN)(char)(auVar105._16_4_ >> 0x18);
                                        local_5b40[0x14] = (RTCHitN)(char)auVar105._20_4_;
                                        local_5b40[0x15] = (RTCHitN)(char)(auVar105._20_4_ >> 8);
                                        local_5b40[0x16] = (RTCHitN)(char)(auVar105._20_4_ >> 0x10);
                                        local_5b40[0x17] = (RTCHitN)(char)(auVar105._20_4_ >> 0x18);
                                        local_5b40[0x18] = (RTCHitN)(char)auVar105._24_4_;
                                        local_5b40[0x19] = (RTCHitN)(char)(auVar105._24_4_ >> 8);
                                        local_5b40[0x1a] = (RTCHitN)(char)(auVar105._24_4_ >> 0x10);
                                        local_5b40[0x1b] = (RTCHitN)(char)(auVar105._24_4_ >> 0x18);
                                        local_5b40[0x1c] = (RTCHitN)(char)auVar105._28_4_;
                                        local_5b40[0x1d] = (RTCHitN)(char)(auVar105._28_4_ >> 8);
                                        local_5b40[0x1e] = (RTCHitN)(char)(auVar105._28_4_ >> 0x10);
                                        local_5b40[0x1f] = (RTCHitN)(char)(auVar105._28_4_ >> 0x18);
                                        local_5b20 = auVar106;
                                        local_5b00._4_4_ = fVar109;
                                        local_5b00._0_4_ = fVar76;
                                        fStack_5af8 = fVar110;
                                        fStack_5af4 = fVar111;
                                        fStack_5af0 = fVar112;
                                        fStack_5aec = fVar113;
                                        fStack_5ae8 = fVar114;
                                        uStack_5ae4 = (uint)bVar74 * auVar86._28_4_ |
                                                      (uint)!bVar74 * auVar89._28_4_;
                                        auVar80 = vpcmpeqd_avx2(auVar106,auVar106);
                                        local_5e18[1] = auVar80;
                                        *local_5e18 = auVar80;
                                        local_5a60 = pRVar12->instID[0];
                                        uStack_5a5c = local_5a60;
                                        uStack_5a58 = local_5a60;
                                        uStack_5a54 = local_5a60;
                                        uStack_5a50 = local_5a60;
                                        uStack_5a4c = local_5a60;
                                        uStack_5a48 = local_5a60;
                                        uStack_5a44 = local_5a60;
                                        local_5a40 = pRVar12->instPrimID[0];
                                        uStack_5a3c = local_5a40;
                                        uStack_5a38 = local_5a40;
                                        uStack_5a34 = local_5a40;
                                        uStack_5a30 = local_5a40;
                                        uStack_5a2c = local_5a40;
                                        uStack_5a28 = local_5a40;
                                        uStack_5a24 = local_5a40;
                                        local_5da0 = *(undefined1 (*) [32])(ray + 0x100);
                                        auVar79 = vblendmps_avx512vl(local_5da0,auVar79);
                                        bVar74 = (bool)(bVar56 >> 1 & 1);
                                        bVar13 = (bool)(bVar56 >> 2 & 1);
                                        bVar14 = (bool)(bVar56 >> 3 & 1);
                                        bVar15 = (bool)(bVar56 >> 4 & 1);
                                        bVar16 = (bool)(bVar56 >> 5 & 1);
                                        bVar18 = (bool)(bVar56 >> 6 & 1);
                                        *(uint *)(ray + 0x100) =
                                             (uint)(bVar56 & 1) * auVar79._0_4_ |
                                             !(bool)(bVar56 & 1) * local_5a40;
                                        *(uint *)(ray + 0x104) =
                                             (uint)bVar74 * auVar79._4_4_ | !bVar74 * local_5a40;
                                        *(uint *)(ray + 0x108) =
                                             (uint)bVar13 * auVar79._8_4_ | !bVar13 * local_5a40;
                                        *(uint *)(ray + 0x10c) =
                                             (uint)bVar14 * auVar79._12_4_ | !bVar14 * local_5a40;
                                        *(uint *)(ray + 0x110) =
                                             (uint)bVar15 * auVar79._16_4_ | !bVar15 * local_5a40;
                                        *(uint *)(ray + 0x114) =
                                             (uint)bVar16 * auVar79._20_4_ | !bVar16 * local_5a40;
                                        *(uint *)(ray + 0x118) =
                                             (uint)bVar18 * auVar79._24_4_ | !bVar18 * local_5a40;
                                        *(uint *)(ray + 0x11c) =
                                             (uint)(bVar56 >> 7) * auVar79._28_4_ |
                                             !(bool)(bVar56 >> 7) * local_5a40;
                                        local_5e00 = vpmovm2d_avx512vl((ulong)bVar56);
                                        local_5e80.geometryUserPtr = pGVar67->userPtr;
                                        local_5e80.valid = (int *)local_5e00;
                                        local_5e80.context = context->user;
                                        local_5e80.ray = (RTCRayN *)ray;
                                        local_5e80.hit = local_5b40;
                                        local_5e80.N = 8;
                                        if (pGVar67->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                          auVar134 = ZEXT1664(auVar101._0_16_);
                                          in_ZMM8 = ZEXT1664(auVar137);
                                          in_ZMM10 = ZEXT1664(auVar150);
                                          (*pGVar67->occlusionFilterN)(&local_5e80);
                                          auVar79 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                          auVar161 = ZEXT3264(auVar79);
                                          auVar79 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                          auVar167 = ZEXT3264(auVar79);
                                          auVar79 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                          auVar166 = ZEXT3264(auVar79);
                                          auVar79 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                          auVar165 = ZEXT3264(auVar79);
                                          auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                          auVar164 = ZEXT3264(auVar79);
                                          auVar79 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                          auVar163 = ZEXT3264(auVar79);
                                          auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                          auVar162 = ZEXT3264(auVar79);
                                          uVar75 = local_5e40._0_8_;
                                          ray = local_5ea8;
                                        }
                                        if (local_5e00 == (undefined1  [32])0x0) {
                                          uVar65 = 0;
                                        }
                                        else {
                                          p_Var11 = context->args->filter;
                                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                                             (((context->args->flags &
                                               RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                              (((pGVar67->field_8).field_0x2 & 0x40) != 0)))) {
                                            auVar134 = ZEXT1664(auVar134._0_16_);
                                            in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
                                            in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
                                            (*p_Var11)(&local_5e80);
                                            auVar79 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                            auVar161 = ZEXT3264(auVar79);
                                            auVar79 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                            auVar167 = ZEXT3264(auVar79);
                                            auVar79 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                            auVar166 = ZEXT3264(auVar79);
                                            auVar79 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                            auVar165 = ZEXT3264(auVar79);
                                            auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                            auVar164 = ZEXT3264(auVar79);
                                            auVar79 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                            auVar163 = ZEXT3264(auVar79);
                                            auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                            auVar162 = ZEXT3264(auVar79);
                                            uVar75 = local_5e40._0_8_;
                                            ray = local_5ea8;
                                          }
                                          uVar65 = vptestmd_avx512vl(local_5e00,local_5e00);
                                          auVar79 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                          bVar74 = (bool)((byte)uVar65 & 1);
                                          bVar13 = (bool)((byte)(uVar65 >> 1) & 1);
                                          bVar14 = (bool)((byte)(uVar65 >> 2) & 1);
                                          bVar15 = (bool)((byte)(uVar65 >> 3) & 1);
                                          bVar16 = (bool)((byte)(uVar65 >> 4) & 1);
                                          bVar18 = (bool)((byte)(uVar65 >> 5) & 1);
                                          bVar21 = (bool)((byte)(uVar65 >> 6) & 1);
                                          bVar24 = SUB81(uVar65 >> 7,0);
                                          *(uint *)(local_5e80.ray + 0x100) =
                                               (uint)bVar74 * auVar79._0_4_ |
                                               (uint)!bVar74 * *(int *)(local_5e80.ray + 0x100);
                                          *(uint *)(local_5e80.ray + 0x104) =
                                               (uint)bVar13 * auVar79._4_4_ |
                                               (uint)!bVar13 * *(int *)(local_5e80.ray + 0x104);
                                          *(uint *)(local_5e80.ray + 0x108) =
                                               (uint)bVar14 * auVar79._8_4_ |
                                               (uint)!bVar14 * *(int *)(local_5e80.ray + 0x108);
                                          *(uint *)(local_5e80.ray + 0x10c) =
                                               (uint)bVar15 * auVar79._12_4_ |
                                               (uint)!bVar15 * *(int *)(local_5e80.ray + 0x10c);
                                          *(uint *)(local_5e80.ray + 0x110) =
                                               (uint)bVar16 * auVar79._16_4_ |
                                               (uint)!bVar16 * *(int *)(local_5e80.ray + 0x110);
                                          *(uint *)(local_5e80.ray + 0x114) =
                                               (uint)bVar18 * auVar79._20_4_ |
                                               (uint)!bVar18 * *(int *)(local_5e80.ray + 0x114);
                                          *(uint *)(local_5e80.ray + 0x118) =
                                               (uint)bVar21 * auVar79._24_4_ |
                                               (uint)!bVar21 * *(int *)(local_5e80.ray + 0x118);
                                          *(uint *)(local_5e80.ray + 0x11c) =
                                               (uint)bVar24 * auVar79._28_4_ |
                                               (uint)!bVar24 * *(int *)(local_5e80.ray + 0x11c);
                                        }
                                        bVar56 = (byte)uVar65;
                                        bVar74 = (bool)((byte)(uVar65 >> 1) & 1);
                                        bVar13 = (bool)((byte)(uVar65 >> 2) & 1);
                                        bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
                                        bVar15 = (bool)((byte)(uVar65 >> 4) & 1);
                                        bVar16 = (bool)((byte)(uVar65 >> 5) & 1);
                                        bVar18 = (bool)((byte)(uVar65 >> 6) & 1);
                                        bVar21 = (bool)((byte)(uVar65 >> 7) & 1);
                                        *(uint *)local_5e90 =
                                             (uint)(bVar56 & 1) * *(int *)local_5e90 |
                                             (uint)!(bool)(bVar56 & 1) * local_5da0._0_4_;
                                        *(uint *)(local_5e90 + 4) =
                                             (uint)bVar74 * *(int *)(local_5e90 + 4) |
                                             (uint)!bVar74 * local_5da0._4_4_;
                                        *(uint *)(local_5e90 + 8) =
                                             (uint)bVar13 * *(int *)(local_5e90 + 8) |
                                             (uint)!bVar13 * local_5da0._8_4_;
                                        *(uint *)(local_5e90 + 0xc) =
                                             (uint)bVar14 * *(int *)(local_5e90 + 0xc) |
                                             (uint)!bVar14 * local_5da0._12_4_;
                                        *(uint *)(local_5e90 + 0x10) =
                                             (uint)bVar15 * *(int *)(local_5e90 + 0x10) |
                                             (uint)!bVar15 * local_5da0._16_4_;
                                        *(uint *)(local_5e90 + 0x14) =
                                             (uint)bVar16 * *(int *)(local_5e90 + 0x14) |
                                             (uint)!bVar16 * local_5da0._20_4_;
                                        *(uint *)(local_5e90 + 0x18) =
                                             (uint)bVar18 * *(int *)(local_5e90 + 0x18) |
                                             (uint)!bVar18 * local_5da0._24_4_;
                                        *(uint *)(local_5e90 + 0x1c) =
                                             (uint)bVar21 * *(int *)(local_5e90 + 0x1c) |
                                             (uint)!bVar21 * local_5da0._28_4_;
                                      }
                                      bVar64 = bVar64 & ~bVar56;
                                      lVar66 = local_5ea0;
                                    }
                                  }
                                }
                              }
                              if (bVar64 == 0) break;
                              puVar63 = puVar63 + 0x10;
                              bVar74 = uVar75 < 3;
                              uVar75 = uVar75 + 1;
                            } while (bVar74);
                            bVar61 = bVar61 & bVar64;
                            bVar74 = bVar61 == 0;
                            lVar60 = local_5db0;
                            uVar65 = local_5da8;
                            uVar75 = local_5e10;
                          }
                        } while ((!bVar74) && (uVar65 = uVar65 - 1 & uVar65, uVar65 != 0));
                      }
                      lVar60 = local_5db8 + 1;
                    } while (lVar60 != local_5dc0);
                    bVar61 = ~bVar61;
                  }
                  local_5ec8 = local_5ec8 | bVar61;
                  if (local_5ec8 == 0xff) {
                    local_5ec8 = 0xff;
                    goto LAB_007d3fac;
                  }
                  auVar79 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar74 = (bool)(local_5ec8 >> 1 & 1);
                  bVar13 = (bool)(local_5ec8 >> 2 & 1);
                  bVar14 = (bool)(local_5ec8 >> 3 & 1);
                  bVar15 = (bool)(local_5ec8 >> 4 & 1);
                  bVar16 = (bool)(local_5ec8 >> 5 & 1);
                  bVar18 = (bool)(local_5ec8 >> 6 & 1);
                  local_5b60 = (uint)(local_5ec8 & 1) * auVar79._0_4_ |
                               !(bool)(local_5ec8 & 1) * local_5b60;
                  uStack_5b5c = (uint)bVar74 * auVar79._4_4_ | !bVar74 * uStack_5b5c;
                  uStack_5b58 = (uint)bVar13 * auVar79._8_4_ | !bVar13 * uStack_5b58;
                  uStack_5b54 = (uint)bVar14 * auVar79._12_4_ | !bVar14 * uStack_5b54;
                  uStack_5b50 = (uint)bVar15 * auVar79._16_4_ | !bVar15 * uStack_5b50;
                  uStack_5b4c = (uint)bVar16 * auVar79._20_4_ | !bVar16 * uStack_5b4c;
                  uStack_5b48 = (uint)bVar18 * auVar79._24_4_ | !bVar18 * uStack_5b48;
                  uStack_5b44 = (uint)(local_5ec8 >> 7) * auVar79._28_4_ |
                                !(bool)(local_5ec8 >> 7) * uStack_5b44;
                }
                goto LAB_007d2983;
              }
              lVar60 = 0;
              auVar79 = auVar164._0_32_;
              do {
                uVar65 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar60 * 8);
                if (uVar65 == 8) {
                  auVar125 = ZEXT3264(auVar79);
                  break;
                }
                uVar72 = *(undefined4 *)(root.ptr + 0x40 + lVar60 * 4);
                auVar80._4_4_ = uVar72;
                auVar80._0_4_ = uVar72;
                auVar80._8_4_ = uVar72;
                auVar80._12_4_ = uVar72;
                auVar80._16_4_ = uVar72;
                auVar80._20_4_ = uVar72;
                auVar80._24_4_ = uVar72;
                auVar80._28_4_ = uVar72;
                auVar81._8_8_ = local_5d00._8_8_;
                auVar81._0_8_ = local_5d00._0_8_;
                auVar81._16_8_ = local_5d00._16_8_;
                auVar81._24_8_ = local_5d00._24_8_;
                auVar101._8_8_ = local_5d00._40_8_;
                auVar101._0_8_ = local_5d00._32_8_;
                auVar101._16_8_ = local_5d00._48_8_;
                auVar101._24_8_ = local_5d00._56_8_;
                auVar25._8_8_ = local_5d00._72_8_;
                auVar25._0_8_ = local_5d00._64_8_;
                auVar25._16_8_ = local_5d00._80_8_;
                auVar25._24_8_ = local_5d00._88_8_;
                auVar80 = vsubps_avx(auVar80,auVar81);
                auVar125._0_4_ = (float)local_5c40._0_4_ * auVar80._0_4_;
                auVar125._4_4_ = (float)local_5c40._4_4_ * auVar80._4_4_;
                auVar125._8_4_ = fStack_5c38 * auVar80._8_4_;
                auVar125._12_4_ = fStack_5c34 * auVar80._12_4_;
                auVar125._16_4_ = fStack_5c30 * auVar80._16_4_;
                auVar125._20_4_ = fStack_5c2c * auVar80._20_4_;
                auVar125._28_36_ = auVar134._28_36_;
                auVar125._24_4_ = fStack_5c28 * auVar80._24_4_;
                auVar96 = auVar125._0_32_;
                auVar134 = ZEXT3264(auVar96);
                uVar72 = *(undefined4 *)(root.ptr + 0x80 + lVar60 * 4);
                auVar84._4_4_ = uVar72;
                auVar84._0_4_ = uVar72;
                auVar84._8_4_ = uVar72;
                auVar84._12_4_ = uVar72;
                auVar84._16_4_ = uVar72;
                auVar84._20_4_ = uVar72;
                auVar84._24_4_ = uVar72;
                auVar84._28_4_ = uVar72;
                auVar80 = vsubps_avx(auVar84,auVar101);
                auVar144._0_4_ = local_5c20._0_4_ * auVar80._0_4_;
                auVar144._4_4_ = local_5c20._4_4_ * auVar80._4_4_;
                auVar144._8_4_ = local_5c20._8_4_ * auVar80._8_4_;
                auVar144._12_4_ = local_5c20._12_4_ * auVar80._12_4_;
                auVar144._16_4_ = local_5c20._16_4_ * auVar80._16_4_;
                auVar144._20_4_ = local_5c20._20_4_ * auVar80._20_4_;
                auVar144._28_36_ = in_ZMM8._28_36_;
                auVar144._24_4_ = local_5c20._24_4_ * auVar80._24_4_;
                auVar84 = auVar144._0_32_;
                in_ZMM8 = ZEXT3264(auVar84);
                uVar72 = *(undefined4 *)(root.ptr + 0xc0 + lVar60 * 4);
                auVar85._4_4_ = uVar72;
                auVar85._0_4_ = uVar72;
                auVar85._8_4_ = uVar72;
                auVar85._12_4_ = uVar72;
                auVar85._16_4_ = uVar72;
                auVar85._20_4_ = uVar72;
                auVar85._24_4_ = uVar72;
                auVar85._28_4_ = uVar72;
                auVar80 = vsubps_avx(auVar85,auVar25);
                auVar155._0_4_ = local_5c00._0_4_ * auVar80._0_4_;
                auVar155._4_4_ = local_5c00._4_4_ * auVar80._4_4_;
                auVar155._8_4_ = local_5c00._8_4_ * auVar80._8_4_;
                auVar155._12_4_ = local_5c00._12_4_ * auVar80._12_4_;
                auVar155._16_4_ = local_5c00._16_4_ * auVar80._16_4_;
                auVar155._20_4_ = local_5c00._20_4_ * auVar80._20_4_;
                auVar155._28_36_ = in_ZMM10._28_36_;
                auVar155._24_4_ = local_5c00._24_4_ * auVar80._24_4_;
                auVar85 = auVar155._0_32_;
                in_ZMM10 = ZEXT3264(auVar85);
                uVar72 = *(undefined4 *)(root.ptr + 0x60 + lVar60 * 4);
                auVar86._4_4_ = uVar72;
                auVar86._0_4_ = uVar72;
                auVar86._8_4_ = uVar72;
                auVar86._12_4_ = uVar72;
                auVar86._16_4_ = uVar72;
                auVar86._20_4_ = uVar72;
                auVar86._24_4_ = uVar72;
                auVar86._28_4_ = uVar72;
                auVar80 = vsubps_avx(auVar86,auVar81);
                auVar82._4_4_ = (float)local_5c40._4_4_ * auVar80._4_4_;
                auVar82._0_4_ = (float)local_5c40._0_4_ * auVar80._0_4_;
                auVar82._8_4_ = fStack_5c38 * auVar80._8_4_;
                auVar82._12_4_ = fStack_5c34 * auVar80._12_4_;
                auVar82._16_4_ = fStack_5c30 * auVar80._16_4_;
                auVar82._20_4_ = fStack_5c2c * auVar80._20_4_;
                auVar82._24_4_ = fStack_5c28 * auVar80._24_4_;
                auVar82._28_4_ = (int)((ulong)local_5d00._24_8_ >> 0x20);
                uVar72 = *(undefined4 *)(root.ptr + 0xa0 + lVar60 * 4);
                auVar87._4_4_ = uVar72;
                auVar87._0_4_ = uVar72;
                auVar87._8_4_ = uVar72;
                auVar87._12_4_ = uVar72;
                auVar87._16_4_ = uVar72;
                auVar87._20_4_ = uVar72;
                auVar87._24_4_ = uVar72;
                auVar87._28_4_ = uVar72;
                auVar80 = vsubps_avx(auVar87,auVar101);
                auVar107._4_4_ = local_5c20._4_4_ * auVar80._4_4_;
                auVar107._0_4_ = local_5c20._0_4_ * auVar80._0_4_;
                auVar107._8_4_ = local_5c20._8_4_ * auVar80._8_4_;
                auVar107._12_4_ = local_5c20._12_4_ * auVar80._12_4_;
                auVar107._16_4_ = local_5c20._16_4_ * auVar80._16_4_;
                auVar107._20_4_ = local_5c20._20_4_ * auVar80._20_4_;
                auVar107._24_4_ = local_5c20._24_4_ * auVar80._24_4_;
                auVar107._28_4_ = (int)((ulong)local_5d00._56_8_ >> 0x20);
                uVar72 = *(undefined4 *)(root.ptr + 0xe0 + lVar60 * 4);
                auVar88._4_4_ = uVar72;
                auVar88._0_4_ = uVar72;
                auVar88._8_4_ = uVar72;
                auVar88._12_4_ = uVar72;
                auVar88._16_4_ = uVar72;
                auVar88._20_4_ = uVar72;
                auVar88._24_4_ = uVar72;
                auVar88._28_4_ = uVar72;
                auVar80 = vsubps_avx(auVar88,auVar25);
                auVar108._4_4_ = local_5c00._4_4_ * auVar80._4_4_;
                auVar108._0_4_ = local_5c00._0_4_ * auVar80._0_4_;
                auVar108._8_4_ = local_5c00._8_4_ * auVar80._8_4_;
                auVar108._12_4_ = local_5c00._12_4_ * auVar80._12_4_;
                auVar108._16_4_ = local_5c00._16_4_ * auVar80._16_4_;
                auVar108._20_4_ = local_5c00._20_4_ * auVar80._20_4_;
                auVar108._24_4_ = local_5c00._24_4_ * auVar80._24_4_;
                auVar108._28_4_ = (int)((ulong)local_5d00._88_8_ >> 0x20);
                auVar80 = vminps_avx(auVar96,auVar82);
                auVar81 = vminps_avx(auVar84,auVar107);
                auVar80 = vmaxps_avx(auVar80,auVar81);
                auVar81 = vminps_avx(auVar85,auVar108);
                auVar80 = vmaxps_avx(auVar80,auVar81);
                auVar83 = vmulps_avx512vl(auVar80,auVar165._0_32_);
                auVar80 = vmaxps_avx(auVar96,auVar82);
                auVar81 = vmaxps_avx(auVar84,auVar107);
                auVar81 = vminps_avx(auVar80,auVar81);
                auVar80 = vmaxps_avx(auVar85,auVar108);
                auVar80 = vminps_avx(auVar81,auVar80);
                auVar81 = vmulps_avx512vl(auVar80,auVar166._0_32_);
                auVar80 = vmaxps_avx(auVar83,local_5b80);
                auVar96._4_4_ = uStack_5b5c;
                auVar96._0_4_ = local_5b60;
                auVar96._8_4_ = uStack_5b58;
                auVar96._12_4_ = uStack_5b54;
                auVar96._16_4_ = uStack_5b50;
                auVar96._20_4_ = uStack_5b4c;
                auVar96._24_4_ = uStack_5b48;
                auVar96._28_4_ = uStack_5b44;
                auVar81 = vminps_avx(auVar81,auVar96);
                uVar59 = vcmpps_avx512vl(auVar80,auVar81,2);
                if ((byte)uVar59 == 0) {
                  auVar125 = ZEXT3264(auVar79);
                  uVar65 = uVar73;
                }
                else {
                  auVar80 = vblendmps_avx512vl(auVar164._0_32_,auVar83);
                  bVar74 = (bool)((byte)uVar59 & 1);
                  bVar13 = (bool)((byte)(uVar59 >> 1) & 1);
                  bVar14 = (bool)((byte)(uVar59 >> 2) & 1);
                  bVar15 = (bool)((byte)(uVar59 >> 3) & 1);
                  bVar16 = (bool)((byte)(uVar59 >> 4) & 1);
                  bVar18 = (bool)((byte)(uVar59 >> 5) & 1);
                  bVar21 = (bool)((byte)(uVar59 >> 6) & 1);
                  bVar24 = SUB81(uVar59 >> 7,0);
                  auVar125 = ZEXT3264(CONCAT428((uint)bVar24 * auVar80._28_4_ |
                                                (uint)!bVar24 * auVar83._28_4_,
                                                CONCAT424((uint)bVar21 * auVar80._24_4_ |
                                                          (uint)!bVar21 * auVar83._24_4_,
                                                          CONCAT420((uint)bVar18 * auVar80._20_4_ |
                                                                    (uint)!bVar18 * auVar83._20_4_,
                                                                    CONCAT416((uint)bVar16 *
                                                                              auVar80._16_4_ |
                                                                              (uint)!bVar16 *
                                                                              auVar83._16_4_,
                                                                              CONCAT412((uint)bVar15
                                                                                        * auVar80.
                                                  _12_4_ | (uint)!bVar15 * auVar83._12_4_,
                                                  CONCAT48((uint)bVar14 * auVar80._8_4_ |
                                                           (uint)!bVar14 * auVar83._8_4_,
                                                           CONCAT44((uint)bVar13 * auVar80._4_4_ |
                                                                    (uint)!bVar13 * auVar83._4_4_,
                                                                    (uint)bVar74 * auVar80._0_4_ |
                                                                    (uint)!bVar74 * auVar83._0_4_)))
                                                  )))));
                  if (uVar73 != 8) {
                    *puVar70 = uVar73;
                    puVar70 = puVar70 + 1;
                    *pauVar69 = auVar79;
                    pauVar69 = pauVar69 + 1;
                  }
                }
                uVar73 = uVar65;
                lVar60 = lVar60 + 1;
                auVar79 = auVar125._0_32_;
              } while (lVar60 != 8);
              if (uVar73 == 8) goto LAB_007d2b5e;
              auVar89._4_4_ = uStack_5b5c;
              auVar89._0_4_ = local_5b60;
              auVar89._8_4_ = uStack_5b58;
              auVar89._12_4_ = uStack_5b54;
              auVar89._16_4_ = uStack_5b50;
              auVar89._20_4_ = uStack_5b4c;
              auVar89._24_4_ = uStack_5b48;
              auVar89._28_4_ = uStack_5b44;
              uVar26 = vcmpps_avx512vl(auVar125._0_32_,auVar89,9);
              root.ptr = uVar73;
            } while ((byte)uVar75 < (byte)POPCOUNT((int)uVar26));
            *puVar70 = uVar73;
            puVar70 = puVar70 + 1;
            *pauVar69 = auVar125._0_32_;
            pauVar69 = pauVar69 + 1;
LAB_007d2b5e:
            iVar58 = 4;
          }
          else {
            do {
              local_5e40 = auVar80;
              k = 0;
              for (uVar75 = uVar73; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
                k = k + 1;
              }
              auVar134 = ZEXT1664(auVar134._0_16_);
              in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
              in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
              bVar74 = occluded1(local_5dd0,local_5dd8,root,k,&local_5ea9,ray,
                                 (TravRayK<8,_true> *)&local_5d00.field_0,context);
              bVar61 = (byte)(1 << ((uint)k & 0x1f));
              if (!bVar74) {
                bVar61 = 0;
              }
              local_5ec8 = local_5ec8 | bVar61;
              uVar73 = uVar73 - 1 & uVar73;
              ray = local_5ea8;
              auVar80 = local_5e40;
            } while (uVar73 != 0);
            iVar58 = 3;
            if (local_5ec8 != 0xff) {
              auVar79 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              bVar74 = (bool)(local_5ec8 >> 1 & 1);
              bVar13 = (bool)(local_5ec8 >> 2 & 1);
              bVar14 = (bool)(local_5ec8 >> 3 & 1);
              bVar15 = (bool)(local_5ec8 >> 4 & 1);
              bVar16 = (bool)(local_5ec8 >> 5 & 1);
              bVar18 = (bool)(local_5ec8 >> 6 & 1);
              local_5b60 = (uint)(local_5ec8 & 1) * auVar79._0_4_ |
                           !(bool)(local_5ec8 & 1) * local_5b60;
              uStack_5b5c = (uint)bVar74 * auVar79._4_4_ | !bVar74 * uStack_5b5c;
              uStack_5b58 = (uint)bVar13 * auVar79._8_4_ | !bVar13 * uStack_5b58;
              uStack_5b54 = (uint)bVar14 * auVar79._12_4_ | !bVar14 * uStack_5b54;
              uStack_5b50 = (uint)bVar15 * auVar79._16_4_ | !bVar15 * uStack_5b50;
              uStack_5b4c = (uint)bVar16 * auVar79._20_4_ | !bVar16 * uStack_5b4c;
              uStack_5b48 = (uint)bVar18 * auVar79._24_4_ | !bVar18 * uStack_5b48;
              uStack_5b44 = (uint)(local_5ec8 >> 7) * auVar79._28_4_ |
                            !(bool)(local_5ec8 >> 7) * uStack_5b44;
              iVar58 = 2;
            }
            auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar162 = ZEXT3264(auVar79);
            auVar79 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar163 = ZEXT3264(auVar79);
            auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar164 = ZEXT3264(auVar79);
            auVar79 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
            auVar165 = ZEXT3264(auVar79);
            auVar79 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
            auVar166 = ZEXT3264(auVar79);
            auVar79 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
            auVar167 = ZEXT3264(auVar79);
            auVar79 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar161 = ZEXT3264(auVar79);
            auVar125 = ZEXT3264(local_5e40);
            uVar75 = local_5e10;
            if ((uint)local_5e10 < (uint)POPCOUNT(uVar72)) goto LAB_007d29cc;
          }
          if (iVar58 == 3) {
LAB_007d3fac:
            local_5ec8 = local_5ec8 & (byte)local_5e84;
            bVar74 = (bool)(local_5ec8 >> 1 & 1);
            bVar13 = (bool)(local_5ec8 >> 2 & 1);
            bVar14 = (bool)(local_5ec8 >> 3 & 1);
            bVar15 = (bool)(local_5ec8 >> 4 & 1);
            bVar16 = (bool)(local_5ec8 >> 5 & 1);
            bVar18 = (bool)(local_5ec8 >> 6 & 1);
            *(uint *)local_5e90 =
                 (uint)(local_5ec8 & 1) * -0x800000 |
                 (uint)!(bool)(local_5ec8 & 1) * *(int *)local_5e90;
            *(uint *)(local_5e90 + 4) =
                 (uint)bVar74 * -0x800000 | (uint)!bVar74 * *(int *)(local_5e90 + 4);
            *(uint *)(local_5e90 + 8) =
                 (uint)bVar13 * -0x800000 | (uint)!bVar13 * *(int *)(local_5e90 + 8);
            *(uint *)(local_5e90 + 0xc) =
                 (uint)bVar14 * -0x800000 | (uint)!bVar14 * *(int *)(local_5e90 + 0xc);
            *(uint *)(local_5e90 + 0x10) =
                 (uint)bVar15 * -0x800000 | (uint)!bVar15 * *(int *)(local_5e90 + 0x10);
            *(uint *)(local_5e90 + 0x14) =
                 (uint)bVar16 * -0x800000 | (uint)!bVar16 * *(int *)(local_5e90 + 0x14);
            *(uint *)(local_5e90 + 0x18) =
                 (uint)bVar18 * -0x800000 | (uint)!bVar18 * *(int *)(local_5e90 + 0x18);
            *(uint *)(local_5e90 + 0x1c) =
                 (uint)(local_5ec8 >> 7) * -0x800000 |
                 (uint)!(bool)(local_5ec8 >> 7) * *(int *)(local_5e90 + 0x1c);
            return;
          }
        } while( true );
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }